

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void __thiscall
embree::avx512::CurveNvIntersectorK<8,16>::
intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
          (CurveNvIntersectorK<8,16> *this,Precalculations *pre,RayHitK<16> *ray,size_t k,
          RayQueryContext *context,Primitive *prim)

{
  Vector *pVVar1;
  uint *puVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  byte bVar91;
  byte bVar92;
  byte bVar93;
  byte bVar94;
  ulong uVar95;
  ulong uVar96;
  byte bVar97;
  int iVar98;
  byte bVar99;
  long lVar100;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  bool bVar101;
  ulong uVar102;
  uint uVar103;
  uint uVar170;
  uint uVar171;
  uint uVar173;
  uint uVar174;
  uint uVar175;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  uint uVar172;
  uint uVar176;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float pp;
  float fVar177;
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar196;
  float fVar198;
  float fVar199;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar195;
  float fVar197;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar194 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar214 [16];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar220;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar238;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar253 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar260 [16];
  float fVar264;
  undefined1 auVar262 [32];
  undefined1 auVar261 [16];
  undefined1 auVar263 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar269 [64];
  float fVar276;
  undefined1 auVar272 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar274;
  float fVar275;
  undefined1 auVar273 [64];
  undefined1 auVar277 [16];
  undefined1 auVar278 [64];
  undefined1 auVar279 [64];
  float fVar281;
  undefined1 auVar280 [64];
  undefined1 auVar282 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [64];
  undefined1 auVar287 [32];
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar291 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  undefined1 *local_ad0;
  undefined8 local_ac8;
  undefined8 local_ac0;
  Precalculations *local_ab8;
  int *local_ab0;
  undefined4 local_aa8;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 (*local_a20) [32];
  long local_a18;
  RayQueryContext *local_a10;
  ulong local_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  
  bVar91 = *(byte *)((long)&context->scene + 1);
  uVar102 = (ulong)bVar91;
  lVar100 = (long)context + uVar102 * 0x19 + 0x16;
  fVar288 = *(float *)((long)context + uVar102 * 0x19 + 0x12);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x40)),
                          ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x20);
  auVar18 = vinsertps_avx(ZEXT416((uint)pre->ray_space[4].vx.field_0.m128[(long)ray]),
                          ZEXT416((uint)pre->ray_space[5].vy.field_0.m128[(long)ray]),0x10);
  auVar109 = vinsertps_avx(auVar18,ZEXT416((uint)pre->ray_space[6].vz.field_0.m128[(long)ray]),0x20)
  ;
  auVar110 = vsubps_avx(auVar17,*(undefined1 (*) [16])((long)context + uVar102 * 0x19 + 6));
  fVar238 = fVar288 * auVar110._0_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 4 + 6);
  auVar122 = vpmovsxbd_avx2(auVar17);
  fVar177 = fVar288 * auVar109._0_4_;
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 5 + 6);
  auVar120 = vpmovsxbd_avx2(auVar18);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 6 + 6);
  auVar123 = vpmovsxbd_avx2(auVar106);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 0xb + 6);
  auVar124 = vpmovsxbd_avx2(auVar107);
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 0xc + 6);
  auVar125 = vpmovsxbd_avx2(auVar104);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 0xd + 6);
  auVar121 = vpmovsxbd_avx2(auVar116);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 0x12 + 6);
  auVar126 = vpmovsxbd_avx2(auVar112);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 0x13 + 6);
  auVar127 = vpmovsxbd_avx2(auVar105);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)((long)&context->scene + uVar102 * 0x14 + 6);
  auVar129 = vpmovsxbd_avx2(auVar108);
  auVar128 = vcvtdq2ps_avx(auVar129);
  auVar140._8_4_ = 1;
  auVar140._0_8_ = 0x100000001;
  auVar140._12_4_ = 1;
  auVar140._16_4_ = 1;
  auVar140._20_4_ = 1;
  auVar140._24_4_ = 1;
  auVar140._28_4_ = 1;
  auVar138._4_4_ = fVar177;
  auVar138._0_4_ = fVar177;
  auVar138._8_4_ = fVar177;
  auVar138._12_4_ = fVar177;
  auVar138._16_4_ = fVar177;
  auVar138._20_4_ = fVar177;
  auVar138._24_4_ = fVar177;
  auVar138._28_4_ = fVar177;
  auVar119 = ZEXT1632(CONCAT412(fVar288 * auVar109._12_4_,
                                CONCAT48(fVar288 * auVar109._8_4_,
                                         CONCAT44(fVar288 * auVar109._4_4_,fVar177))));
  auVar130 = vpermps_avx2(auVar140,auVar119);
  auVar117 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = vpermps_avx512vl(auVar117,auVar119);
  fVar177 = auVar118._0_4_;
  auVar194._0_4_ = fVar177 * auVar123._0_4_;
  fVar195 = auVar118._4_4_;
  auVar194._4_4_ = fVar195 * auVar123._4_4_;
  fVar197 = auVar118._8_4_;
  auVar194._8_4_ = fVar197 * auVar123._8_4_;
  fVar274 = auVar118._12_4_;
  auVar194._12_4_ = fVar274 * auVar123._12_4_;
  fVar275 = auVar118._16_4_;
  auVar194._16_4_ = fVar275 * auVar123._16_4_;
  fVar276 = auVar118._20_4_;
  auVar194._20_4_ = fVar276 * auVar123._20_4_;
  fVar254 = auVar118._24_4_;
  auVar194._28_36_ = in_ZMM4._28_36_;
  auVar194._24_4_ = fVar254 * auVar123._24_4_;
  auVar119._4_4_ = auVar121._4_4_ * fVar195;
  auVar119._0_4_ = auVar121._0_4_ * fVar177;
  auVar119._8_4_ = auVar121._8_4_ * fVar197;
  auVar119._12_4_ = auVar121._12_4_ * fVar274;
  auVar119._16_4_ = auVar121._16_4_ * fVar275;
  auVar119._20_4_ = auVar121._20_4_ * fVar276;
  auVar119._24_4_ = auVar121._24_4_ * fVar254;
  auVar119._28_4_ = auVar129._28_4_;
  auVar129._4_4_ = fVar195 * auVar128._4_4_;
  auVar129._0_4_ = fVar177 * auVar128._0_4_;
  auVar129._8_4_ = fVar197 * auVar128._8_4_;
  auVar129._12_4_ = fVar274 * auVar128._12_4_;
  auVar129._16_4_ = fVar275 * auVar128._16_4_;
  auVar129._20_4_ = fVar276 * auVar128._20_4_;
  auVar129._24_4_ = fVar254 * auVar128._24_4_;
  auVar129._28_4_ = auVar118._28_4_;
  auVar17 = vfmadd231ps_fma(auVar194._0_32_,auVar130,auVar120);
  auVar18 = vfmadd231ps_fma(auVar119,auVar130,auVar125);
  auVar106 = vfmadd231ps_fma(auVar129,auVar127,auVar130);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar138,auVar122);
  auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar138,auVar124);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar126,auVar138);
  auVar139._4_4_ = fVar238;
  auVar139._0_4_ = fVar238;
  auVar139._8_4_ = fVar238;
  auVar139._12_4_ = fVar238;
  auVar139._16_4_ = fVar238;
  auVar139._20_4_ = fVar238;
  auVar139._24_4_ = fVar238;
  auVar139._28_4_ = fVar238;
  auVar130 = ZEXT1632(CONCAT412(fVar288 * auVar110._12_4_,
                                CONCAT48(fVar288 * auVar110._8_4_,
                                         CONCAT44(fVar288 * auVar110._4_4_,fVar238))));
  auVar129 = vpermps_avx2(auVar140,auVar130);
  auVar119 = vpermps_avx512vl(auVar117,auVar130);
  fVar288 = auVar119._0_4_;
  fVar177 = auVar119._4_4_;
  auVar130._4_4_ = fVar177 * auVar123._4_4_;
  auVar130._0_4_ = fVar288 * auVar123._0_4_;
  fVar195 = auVar119._8_4_;
  auVar130._8_4_ = fVar195 * auVar123._8_4_;
  fVar197 = auVar119._12_4_;
  auVar130._12_4_ = fVar197 * auVar123._12_4_;
  fVar274 = auVar119._16_4_;
  auVar130._16_4_ = fVar274 * auVar123._16_4_;
  fVar275 = auVar119._20_4_;
  auVar130._20_4_ = fVar275 * auVar123._20_4_;
  fVar276 = auVar119._24_4_;
  auVar130._24_4_ = fVar276 * auVar123._24_4_;
  auVar130._28_4_ = auVar123._28_4_;
  auVar133._0_4_ = fVar288 * auVar121._0_4_;
  auVar133._4_4_ = fVar177 * auVar121._4_4_;
  auVar133._8_4_ = fVar195 * auVar121._8_4_;
  auVar133._12_4_ = fVar197 * auVar121._12_4_;
  auVar133._16_4_ = fVar274 * auVar121._16_4_;
  auVar133._20_4_ = fVar275 * auVar121._20_4_;
  auVar133._24_4_ = fVar276 * auVar121._24_4_;
  auVar133._28_4_ = 0;
  auVar121._4_4_ = fVar177 * auVar128._4_4_;
  auVar121._0_4_ = fVar288 * auVar128._0_4_;
  auVar121._8_4_ = fVar195 * auVar128._8_4_;
  auVar121._12_4_ = fVar197 * auVar128._12_4_;
  auVar121._16_4_ = fVar274 * auVar128._16_4_;
  auVar121._20_4_ = fVar275 * auVar128._20_4_;
  auVar121._24_4_ = fVar276 * auVar128._24_4_;
  auVar121._28_4_ = auVar128._28_4_;
  auVar107 = vfmadd231ps_fma(auVar130,auVar129,auVar120);
  auVar104 = vfmadd231ps_fma(auVar133,auVar129,auVar125);
  auVar116 = vfmadd231ps_fma(auVar121,auVar129,auVar127);
  auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar139,auVar122);
  auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar139,auVar124);
  auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar139,auVar126);
  auVar135._8_4_ = 0x7fffffff;
  auVar135._0_8_ = 0x7fffffff7fffffff;
  auVar135._12_4_ = 0x7fffffff;
  auVar135._16_4_ = 0x7fffffff;
  auVar135._20_4_ = 0x7fffffff;
  auVar135._24_4_ = 0x7fffffff;
  auVar135._28_4_ = 0x7fffffff;
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  auVar137._16_4_ = 0x219392ef;
  auVar137._20_4_ = 0x219392ef;
  auVar137._24_4_ = 0x219392ef;
  auVar137._28_4_ = 0x219392ef;
  auVar122 = vandps_avx(ZEXT1632(auVar17),auVar135);
  uVar95 = vcmpps_avx512vl(auVar122,auVar137,1);
  bVar101 = (bool)((byte)uVar95 & 1);
  auVar117._0_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar17._0_4_;
  bVar101 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar117._4_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar17._4_4_;
  bVar101 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar117._8_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar17._8_4_;
  bVar101 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar117._12_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar17._12_4_;
  auVar117._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar117._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar117._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar117._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar122 = vandps_avx(ZEXT1632(auVar18),auVar135);
  uVar95 = vcmpps_avx512vl(auVar122,auVar137,1);
  bVar101 = (bool)((byte)uVar95 & 1);
  auVar118._0_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar18._0_4_;
  bVar101 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar118._4_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar18._4_4_;
  bVar101 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar118._8_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar18._8_4_;
  bVar101 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar118._12_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar18._12_4_;
  auVar118._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar118._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar118._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar118._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar122 = vandps_avx(ZEXT1632(auVar106),auVar135);
  uVar95 = vcmpps_avx512vl(auVar122,auVar137,1);
  bVar101 = (bool)((byte)uVar95 & 1);
  auVar122._0_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar106._0_4_;
  bVar101 = (bool)((byte)(uVar95 >> 1) & 1);
  auVar122._4_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar106._4_4_;
  bVar101 = (bool)((byte)(uVar95 >> 2) & 1);
  auVar122._8_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar106._8_4_;
  bVar101 = (bool)((byte)(uVar95 >> 3) & 1);
  auVar122._12_4_ = (uint)bVar101 * 0x219392ef | (uint)!bVar101 * auVar106._12_4_;
  auVar122._16_4_ = (uint)((byte)(uVar95 >> 4) & 1) * 0x219392ef;
  auVar122._20_4_ = (uint)((byte)(uVar95 >> 5) & 1) * 0x219392ef;
  auVar122._24_4_ = (uint)((byte)(uVar95 >> 6) & 1) * 0x219392ef;
  auVar122._28_4_ = (uint)(byte)(uVar95 >> 7) * 0x219392ef;
  auVar120 = vrcp14ps_avx512vl(auVar117);
  auVar136._8_4_ = 0x3f800000;
  auVar136._0_8_ = 0x3f8000003f800000;
  auVar136._12_4_ = 0x3f800000;
  auVar136._16_4_ = 0x3f800000;
  auVar136._20_4_ = 0x3f800000;
  auVar136._24_4_ = 0x3f800000;
  auVar136._28_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar117,auVar120,auVar136);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar120,auVar120);
  auVar120 = vrcp14ps_avx512vl(auVar118);
  auVar18 = vfnmadd213ps_fma(auVar118,auVar120,auVar136);
  auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar120,auVar120);
  auVar120 = vrcp14ps_avx512vl(auVar122);
  auVar106 = vfnmadd213ps_fma(auVar122,auVar120,auVar136);
  auVar106 = vfmadd132ps_fma(ZEXT1632(auVar106),auVar120,auVar120);
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar102 * 7 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar107));
  auVar126._4_4_ = auVar17._4_4_ * auVar122._4_4_;
  auVar126._0_4_ = auVar17._0_4_ * auVar122._0_4_;
  auVar126._8_4_ = auVar17._8_4_ * auVar122._8_4_;
  auVar126._12_4_ = auVar17._12_4_ * auVar122._12_4_;
  auVar126._16_4_ = auVar122._16_4_ * 0.0;
  auVar126._20_4_ = auVar122._20_4_ * 0.0;
  auVar126._24_4_ = auVar122._24_4_ * 0.0;
  auVar126._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar102 * 9 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar107));
  auVar134._0_4_ = auVar17._0_4_ * auVar122._0_4_;
  auVar134._4_4_ = auVar17._4_4_ * auVar122._4_4_;
  auVar134._8_4_ = auVar17._8_4_ * auVar122._8_4_;
  auVar134._12_4_ = auVar17._12_4_ * auVar122._12_4_;
  auVar134._16_4_ = auVar122._16_4_ * 0.0;
  auVar134._20_4_ = auVar122._20_4_ * 0.0;
  auVar134._24_4_ = auVar122._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar102 * 0xe + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar104));
  auVar127._4_4_ = auVar18._4_4_ * auVar122._4_4_;
  auVar127._0_4_ = auVar18._0_4_ * auVar122._0_4_;
  auVar127._8_4_ = auVar18._8_4_ * auVar122._8_4_;
  auVar127._12_4_ = auVar18._12_4_ * auVar122._12_4_;
  auVar127._16_4_ = auVar122._16_4_ * 0.0;
  auVar127._20_4_ = auVar122._20_4_ * 0.0;
  auVar127._24_4_ = auVar122._24_4_ * 0.0;
  auVar127._28_4_ = auVar122._28_4_;
  auVar121 = vpbroadcastd_avx512vl();
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + (ulong)bVar91 * 0x10 + 6)
                           );
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar104));
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar102 * 0x15 + 6));
  auVar132._0_4_ = auVar18._0_4_ * auVar122._0_4_;
  auVar132._4_4_ = auVar18._4_4_ * auVar122._4_4_;
  auVar132._8_4_ = auVar18._8_4_ * auVar122._8_4_;
  auVar132._12_4_ = auVar18._12_4_ * auVar122._12_4_;
  auVar132._16_4_ = auVar122._16_4_ * 0.0;
  auVar132._20_4_ = auVar122._20_4_ * 0.0;
  auVar132._24_4_ = auVar122._24_4_ * 0.0;
  auVar132._28_4_ = 0;
  auVar122 = vcvtdq2ps_avx(auVar120);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar116));
  auVar128._4_4_ = auVar122._4_4_ * auVar106._4_4_;
  auVar128._0_4_ = auVar122._0_4_ * auVar106._0_4_;
  auVar128._8_4_ = auVar122._8_4_ * auVar106._8_4_;
  auVar128._12_4_ = auVar122._12_4_ * auVar106._12_4_;
  auVar128._16_4_ = auVar122._16_4_ * 0.0;
  auVar128._20_4_ = auVar122._20_4_ * 0.0;
  auVar128._24_4_ = auVar122._24_4_ * 0.0;
  auVar128._28_4_ = auVar122._28_4_;
  auVar122 = vpmovsxwd_avx2(*(undefined1 (*) [16])((long)&context->scene + uVar102 * 0x17 + 6));
  auVar122 = vcvtdq2ps_avx(auVar122);
  auVar122 = vsubps_avx(auVar122,ZEXT1632(auVar116));
  auVar131._0_4_ = auVar106._0_4_ * auVar122._0_4_;
  auVar131._4_4_ = auVar106._4_4_ * auVar122._4_4_;
  auVar131._8_4_ = auVar106._8_4_ * auVar122._8_4_;
  auVar131._12_4_ = auVar106._12_4_ * auVar122._12_4_;
  auVar131._16_4_ = auVar122._16_4_ * 0.0;
  auVar131._20_4_ = auVar122._20_4_ * 0.0;
  auVar131._24_4_ = auVar122._24_4_ * 0.0;
  auVar131._28_4_ = 0;
  auVar122 = vpminsd_avx2(auVar126,auVar134);
  auVar120 = vpminsd_avx2(auVar127,auVar132);
  auVar122 = vmaxps_avx(auVar122,auVar120);
  auVar120 = vpminsd_avx2(auVar128,auVar131);
  uVar203 = *(undefined4 *)((long)&pre->ray_space[2].vz.field_0 + (long)ray * 4);
  auVar123._4_4_ = uVar203;
  auVar123._0_4_ = uVar203;
  auVar123._8_4_ = uVar203;
  auVar123._12_4_ = uVar203;
  auVar123._16_4_ = uVar203;
  auVar123._20_4_ = uVar203;
  auVar123._24_4_ = uVar203;
  auVar123._28_4_ = uVar203;
  auVar120 = vmaxps_avx512vl(auVar120,auVar123);
  auVar122 = vmaxps_avx(auVar122,auVar120);
  auVar120._8_4_ = 0x3f7ffffa;
  auVar120._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar120._12_4_ = 0x3f7ffffa;
  auVar120._16_4_ = 0x3f7ffffa;
  auVar120._20_4_ = 0x3f7ffffa;
  auVar120._24_4_ = 0x3f7ffffa;
  auVar120._28_4_ = 0x3f7ffffa;
  local_640 = vmulps_avx512vl(auVar122,auVar120);
  auVar122 = vpmaxsd_avx2(auVar126,auVar134);
  auVar120 = vpmaxsd_avx2(auVar127,auVar132);
  auVar122 = vminps_avx(auVar122,auVar120);
  auVar120 = vpmaxsd_avx2(auVar128,auVar131);
  uVar203 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
  auVar124._4_4_ = uVar203;
  auVar124._0_4_ = uVar203;
  auVar124._8_4_ = uVar203;
  auVar124._12_4_ = uVar203;
  auVar124._16_4_ = uVar203;
  auVar124._20_4_ = uVar203;
  auVar124._24_4_ = uVar203;
  auVar124._28_4_ = uVar203;
  auVar120 = vminps_avx512vl(auVar120,auVar124);
  auVar122 = vminps_avx(auVar122,auVar120);
  auVar125._8_4_ = 0x3f800003;
  auVar125._0_8_ = 0x3f8000033f800003;
  auVar125._12_4_ = 0x3f800003;
  auVar125._16_4_ = 0x3f800003;
  auVar125._20_4_ = 0x3f800003;
  auVar125._24_4_ = 0x3f800003;
  auVar125._28_4_ = 0x3f800003;
  auVar122 = vmulps_avx512vl(auVar122,auVar125);
  uVar21 = vcmpps_avx512vl(local_640,auVar122,2);
  uVar23 = vpcmpgtd_avx512vl(auVar121,_DAT_01fb4ba0);
  local_a08 = CONCAT44((int)((ulong)prim >> 0x20),(uint)(byte)((byte)uVar21 & (byte)uVar23));
  local_a20 = (undefined1 (*) [32])local_240;
  auVar194 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)ray & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar194);
  local_a18 = lVar100;
  local_a10 = context;
LAB_019dea51:
  iVar98 = 1;
  if (local_a08 == 0) {
    return;
  }
  lVar25 = 0;
  for (uVar95 = local_a08; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  local_a08 = local_a08 - 1 & local_a08;
  fVar288 = *(float *)((long)&context->scene + lVar25 * 4 + 6);
  uVar95 = (ulong)(uint)((int)lVar25 << 6);
  auVar17 = *(undefined1 (*) [16])(lVar100 + uVar95);
  if (local_a08 != 0) {
    uVar96 = local_a08 - 1 & local_a08;
    for (uVar102 = local_a08; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
    }
    if (uVar96 != 0) {
      for (; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar18 = *(undefined1 (*) [16])(lVar100 + 0x10 + uVar95);
  auVar106 = *(undefined1 (*) [16])(lVar100 + 0x20 + uVar95);
  auVar107 = *(undefined1 (*) [16])(lVar100 + 0x30 + uVar95);
  auVar104 = vinsertps_avx(ZEXT416(*(uint *)((long)pre->ray_space + (long)ray * 4 + -0x40)),
                           ZEXT416((uint)pre->ray_space[0].vx.field_0.m128[(long)ray]),0x1c);
  auVar116 = vinsertps_avx(auVar104,ZEXT416((uint)pre->ray_space[1].vy.field_0.m128[(long)ray]),0x28
                          );
  uVar203 = *(undefined4 *)((long)&pre->ray_space[4].vx.field_0 + (long)ray * 4);
  auVar111._4_4_ = uVar203;
  auVar111._0_4_ = uVar203;
  auVar111._8_4_ = uVar203;
  auVar111._12_4_ = uVar203;
  local_820._16_4_ = uVar203;
  local_820._0_16_ = auVar111;
  local_820._20_4_ = uVar203;
  local_820._24_4_ = uVar203;
  local_820._28_4_ = uVar203;
  auVar286 = ZEXT3264(local_820);
  uVar203 = *(undefined4 *)((long)&pre->ray_space[5].vy.field_0 + (long)ray * 4);
  auVar115._4_4_ = uVar203;
  auVar115._0_4_ = uVar203;
  auVar115._8_4_ = uVar203;
  auVar115._12_4_ = uVar203;
  local_6c0._16_4_ = uVar203;
  local_6c0._0_16_ = auVar115;
  local_6c0._20_4_ = uVar203;
  local_6c0._24_4_ = uVar203;
  local_6c0._28_4_ = uVar203;
  auVar104 = vunpcklps_avx(auVar111,auVar115);
  fVar177 = *(float *)((long)&pre->ray_space[6].vz.field_0 + (long)ray * 4);
  auVar277._4_4_ = fVar177;
  auVar277._0_4_ = fVar177;
  auVar277._8_4_ = fVar177;
  auVar277._12_4_ = fVar177;
  local_840._16_4_ = fVar177;
  local_840._0_16_ = auVar277;
  local_840._20_4_ = fVar177;
  local_840._24_4_ = fVar177;
  local_840._28_4_ = fVar177;
  local_9d0 = vinsertps_avx(auVar104,auVar277,0x28);
  auVar278 = ZEXT1664(local_9d0);
  auVar110._0_4_ = auVar17._0_4_ + auVar18._0_4_ + auVar106._0_4_ + auVar107._0_4_;
  auVar110._4_4_ = auVar17._4_4_ + auVar18._4_4_ + auVar106._4_4_ + auVar107._4_4_;
  auVar110._8_4_ = auVar17._8_4_ + auVar18._8_4_ + auVar106._8_4_ + auVar107._8_4_;
  auVar110._12_4_ = auVar17._12_4_ + auVar18._12_4_ + auVar106._12_4_ + auVar107._12_4_;
  auVar109._8_4_ = 0x3e800000;
  auVar109._0_8_ = 0x3e8000003e800000;
  auVar109._12_4_ = 0x3e800000;
  auVar104 = vmulps_avx512vl(auVar110,auVar109);
  auVar104 = vsubps_avx(auVar104,auVar116);
  auVar104 = vdpps_avx(auVar104,local_9d0,0x7f);
  fVar197 = *(float *)((long)&context->scene + 2);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar280 = ZEXT1664(local_9e0);
  fVar195 = pre->ray_space[2].vz.field_0.m128[(long)ray];
  auVar282 = ZEXT464((uint)fVar195);
  auVar113._4_12_ = ZEXT812(0) << 0x20;
  auVar113._0_4_ = local_9e0._0_4_;
  auVar105 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar113);
  auVar112 = vfnmadd213ss_fma(auVar105,local_9e0,ZEXT416(0x40000000));
  local_620 = auVar104._0_4_ * auVar105._0_4_ * auVar112._0_4_;
  auVar114._4_4_ = local_620;
  auVar114._0_4_ = local_620;
  auVar114._8_4_ = local_620;
  auVar114._12_4_ = local_620;
  fStack_7d0 = local_620;
  _local_7e0 = auVar114;
  fStack_7cc = local_620;
  fStack_7c8 = local_620;
  fStack_7c4 = local_620;
  auVar104 = vfmadd231ps_fma(auVar116,local_9d0,auVar114);
  auVar104 = vblendps_avx(auVar104,ZEXT816(0) << 0x40,8);
  auVar17 = vsubps_avx(auVar17,auVar104);
  auVar106 = vsubps_avx(auVar106,auVar104);
  auVar269 = ZEXT1664(auVar106);
  auVar18 = vsubps_avx(auVar18,auVar104);
  auVar273 = ZEXT1664(auVar18);
  auVar107 = vsubps_avx(auVar107,auVar104);
  auVar122 = vbroadcastss_avx512vl(auVar17);
  auVar142._8_4_ = 1;
  auVar142._0_8_ = 0x100000001;
  auVar142._12_4_ = 1;
  auVar142._16_4_ = 1;
  auVar142._20_4_ = 1;
  auVar142._24_4_ = 1;
  auVar142._28_4_ = 1;
  local_960 = ZEXT1632(auVar17);
  auVar120 = vpermps_avx512vl(auVar142,local_960);
  auVar143._8_4_ = 2;
  auVar143._0_8_ = 0x200000002;
  auVar143._12_4_ = 2;
  auVar143._16_4_ = 2;
  auVar143._20_4_ = 2;
  auVar143._24_4_ = 2;
  auVar143._28_4_ = 2;
  auVar123 = vpermps_avx512vl(auVar143,local_960);
  auVar144._8_4_ = 3;
  auVar144._0_8_ = 0x300000003;
  auVar144._12_4_ = 3;
  auVar144._16_4_ = 3;
  auVar144._20_4_ = 3;
  auVar144._24_4_ = 3;
  auVar144._28_4_ = 3;
  auVar124 = vpermps_avx512vl(auVar144,local_960);
  auVar125 = vbroadcastss_avx512vl(auVar18);
  local_9a0 = ZEXT1632(auVar18);
  auVar121 = vpermps_avx512vl(auVar142,local_9a0);
  auVar126 = vpermps_avx512vl(auVar143,local_9a0);
  auVar127 = vpermps_avx512vl(auVar144,local_9a0);
  auVar128 = vbroadcastss_avx512vl(auVar106);
  local_980 = ZEXT1632(auVar106);
  auVar129 = vpermps_avx512vl(auVar142,local_980);
  auVar130 = vpermps_avx512vl(auVar143,local_980);
  auVar119 = vpermps_avx512vl(auVar144,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar107);
  _local_9c0 = ZEXT1632(auVar107);
  local_5c0 = vpermps_avx2(auVar142,_local_9c0);
  local_580 = vpermps_avx512vl(auVar143,_local_9c0);
  local_600 = vpermps_avx2(auVar144,_local_9c0);
  auVar17 = vfmadd231ps_fma(ZEXT432((uint)(fVar177 * fVar177)),local_6c0,local_6c0);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_820,local_820);
  local_560._0_4_ = auVar17._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar141._8_4_ = 0x7fffffff;
  auVar141._0_8_ = 0x7fffffff7fffffff;
  auVar141._12_4_ = 0x7fffffff;
  auVar141._16_4_ = 0x7fffffff;
  auVar141._20_4_ = 0x7fffffff;
  auVar141._24_4_ = 0x7fffffff;
  auVar141._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar141);
  local_940 = ZEXT416((uint)local_620);
  local_620 = fVar195 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar194 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar194);
  uVar95 = 0;
  auVar194 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar194);
  auVar17 = vsqrtss_avx(local_9e0,local_9e0);
  auVar18 = vsqrtss_avx(local_9e0,local_9e0);
  local_6f0 = ZEXT816(0x3f80000000000000);
  auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar291 = ZEXT3264(auVar117);
  auVar194 = ZEXT3264(_DAT_01f7b040);
  local_5e0 = local_580;
  do {
    auVar106 = vmovshdup_avx(local_6f0);
    auVar106 = vsubps_avx(auVar106,local_6f0);
    auVar185._0_4_ = auVar106._0_4_;
    fVar20 = auVar185._0_4_ * 0.04761905;
    uVar203 = local_6f0._0_4_;
    local_a60._4_4_ = uVar203;
    local_a60._0_4_ = uVar203;
    local_a60._8_4_ = uVar203;
    local_a60._12_4_ = uVar203;
    local_a60._16_4_ = uVar203;
    local_a60._20_4_ = uVar203;
    local_a60._24_4_ = uVar203;
    local_a60._28_4_ = uVar203;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar106 = vfmadd231ps_fma(local_a60,auVar185,auVar194._0_32_);
    auVar118 = vsubps_avx512vl(auVar291._0_32_,ZEXT1632(auVar106));
    fVar177 = auVar118._0_4_;
    fVar275 = auVar118._4_4_;
    fVar254 = auVar118._8_4_;
    fVar255 = auVar118._12_4_;
    fVar290 = auVar118._16_4_;
    fVar220 = auVar118._20_4_;
    fVar19 = auVar118._24_4_;
    fVar178 = fVar177 * fVar177 * fVar177;
    fVar196 = fVar275 * fVar275 * fVar275;
    auVar151._4_4_ = fVar196;
    auVar151._0_4_ = fVar178;
    fVar198 = fVar254 * fVar254 * fVar254;
    auVar151._8_4_ = fVar198;
    fVar199 = fVar255 * fVar255 * fVar255;
    auVar151._12_4_ = fVar199;
    fVar200 = fVar290 * fVar290 * fVar290;
    auVar151._16_4_ = fVar200;
    fVar201 = fVar220 * fVar220 * fVar220;
    auVar151._20_4_ = fVar201;
    fVar202 = fVar19 * fVar19 * fVar19;
    auVar151._24_4_ = fVar202;
    auVar151._28_4_ = auVar185._0_4_;
    auVar117 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar131 = vmulps_avx512vl(auVar151,auVar117);
    fVar274 = auVar106._0_4_;
    fVar276 = auVar106._4_4_;
    fVar238 = auVar106._8_4_;
    fVar289 = auVar106._12_4_;
    fVar219 = fVar274 * fVar274 * fVar274;
    fVar235 = fVar276 * fVar276 * fVar276;
    fVar236 = fVar238 * fVar238 * fVar238;
    fVar237 = fVar289 * fVar289 * fVar289;
    auVar279._0_4_ = fVar274 * fVar177;
    auVar279._4_4_ = fVar276 * fVar275;
    auVar279._8_4_ = fVar238 * fVar254;
    auVar279._12_4_ = fVar289 * fVar255;
    auVar279._16_4_ = fVar290 * 0.0;
    auVar279._20_4_ = fVar220 * 0.0;
    auVar279._28_36_ = auVar278._28_36_;
    auVar279._24_4_ = fVar19 * 0.0;
    auVar132 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(fVar235,fVar219)
                                                                  ))),auVar117);
    fVar281 = auVar132._28_4_ + auVar185._0_4_;
    fVar264 = fVar281 + auVar282._28_4_ + auVar194._28_4_;
    auVar152._4_4_ = fVar196 * 0.16666667;
    auVar152._0_4_ = fVar178 * 0.16666667;
    auVar152._8_4_ = fVar198 * 0.16666667;
    auVar152._12_4_ = fVar199 * 0.16666667;
    auVar152._16_4_ = fVar200 * 0.16666667;
    auVar152._20_4_ = fVar201 * 0.16666667;
    auVar152._24_4_ = fVar202 * 0.16666667;
    auVar152._28_4_ = fVar281;
    auVar153._4_4_ =
         (auVar279._4_4_ * fVar275 * 12.0 + auVar279._4_4_ * fVar276 * 6.0 +
         fVar235 + auVar131._4_4_) * 0.16666667;
    auVar153._0_4_ =
         (auVar279._0_4_ * fVar177 * 12.0 + auVar279._0_4_ * fVar274 * 6.0 +
         fVar219 + auVar131._0_4_) * 0.16666667;
    auVar153._8_4_ =
         (auVar279._8_4_ * fVar254 * 12.0 + auVar279._8_4_ * fVar238 * 6.0 +
         fVar236 + auVar131._8_4_) * 0.16666667;
    auVar153._12_4_ =
         (auVar279._12_4_ * fVar255 * 12.0 + auVar279._12_4_ * fVar289 * 6.0 +
         fVar237 + auVar131._12_4_) * 0.16666667;
    auVar153._16_4_ =
         (auVar279._16_4_ * fVar290 * 12.0 + auVar279._16_4_ * 0.0 * 6.0 + auVar131._16_4_ + 0.0) *
         0.16666667;
    auVar153._20_4_ =
         (auVar279._20_4_ * fVar220 * 12.0 + auVar279._20_4_ * 0.0 * 6.0 + auVar131._20_4_ + 0.0) *
         0.16666667;
    auVar153._24_4_ =
         (auVar279._24_4_ * fVar19 * 12.0 + auVar279._24_4_ * 0.0 * 6.0 + auVar131._24_4_ + 0.0) *
         0.16666667;
    auVar153._28_4_ = auVar282._28_4_;
    auVar154._4_4_ =
         (auVar132._4_4_ + fVar196 +
         auVar279._4_4_ * fVar276 * 12.0 + auVar279._4_4_ * fVar275 * 6.0) * 0.16666667;
    auVar154._0_4_ =
         (auVar132._0_4_ + fVar178 +
         auVar279._0_4_ * fVar274 * 12.0 + auVar279._0_4_ * fVar177 * 6.0) * 0.16666667;
    auVar154._8_4_ =
         (auVar132._8_4_ + fVar198 +
         auVar279._8_4_ * fVar238 * 12.0 + auVar279._8_4_ * fVar254 * 6.0) * 0.16666667;
    auVar154._12_4_ =
         (auVar132._12_4_ + fVar199 +
         auVar279._12_4_ * fVar289 * 12.0 + auVar279._12_4_ * fVar255 * 6.0) * 0.16666667;
    auVar154._16_4_ =
         (auVar132._16_4_ + fVar200 + auVar279._16_4_ * 0.0 * 12.0 + auVar279._16_4_ * fVar290 * 6.0
         ) * 0.16666667;
    auVar154._20_4_ =
         (auVar132._20_4_ + fVar201 + auVar279._20_4_ * 0.0 * 12.0 + auVar279._20_4_ * fVar220 * 6.0
         ) * 0.16666667;
    auVar154._24_4_ =
         (auVar132._24_4_ + fVar202 + auVar279._24_4_ * 0.0 * 12.0 + auVar279._24_4_ * fVar19 * 6.0)
         * 0.16666667;
    auVar154._28_4_ = auVar286._28_4_;
    fVar219 = fVar219 * 0.16666667;
    fVar235 = fVar235 * 0.16666667;
    fVar236 = fVar236 * 0.16666667;
    fVar237 = fVar237 * 0.16666667;
    auVar155._28_4_ = fVar264;
    auVar155._0_28_ = ZEXT1628(CONCAT412(fVar237,CONCAT48(fVar236,CONCAT44(fVar235,fVar219))));
    auVar132 = vmulps_avx512vl(local_5a0,auVar155);
    auVar149._4_4_ = local_5c0._4_4_ * fVar235;
    auVar149._0_4_ = local_5c0._0_4_ * fVar219;
    auVar149._8_4_ = local_5c0._8_4_ * fVar236;
    auVar149._12_4_ = local_5c0._12_4_ * fVar237;
    auVar149._16_4_ = local_5c0._16_4_ * 0.0;
    auVar149._20_4_ = local_5c0._20_4_ * 0.0;
    auVar149._24_4_ = local_5c0._24_4_ * 0.0;
    auVar149._28_4_ = auVar280._28_4_ + auVar286._28_4_ + auVar131._28_4_ + 0.0;
    auVar131 = vmulps_avx512vl(local_5e0,auVar155);
    auVar156._4_4_ = local_600._4_4_ * fVar235;
    auVar156._0_4_ = local_600._0_4_ * fVar219;
    auVar156._8_4_ = local_600._8_4_ * fVar236;
    auVar156._12_4_ = local_600._12_4_ * fVar237;
    auVar156._16_4_ = local_600._16_4_ * 0.0;
    auVar156._20_4_ = local_600._20_4_ * 0.0;
    auVar156._24_4_ = local_600._24_4_ * 0.0;
    auVar156._28_4_ = fVar264;
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar154,auVar128);
    auVar133 = vfmadd231ps_avx512vl(auVar149,auVar154,auVar129);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar154,auVar130);
    auVar134 = vfmadd231ps_avx512vl(auVar156,auVar119,auVar154);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar153,auVar125);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar153,auVar121);
    auVar131 = vfmadd231ps_avx512vl(auVar131,auVar153,auVar126);
    auVar134 = vfmadd231ps_avx512vl(auVar134,auVar127,auVar153);
    auVar135 = vfmadd231ps_avx512vl(auVar132,auVar152,auVar122);
    auVar136 = vfmadd231ps_avx512vl(auVar133,auVar152,auVar120);
    auVar137 = vfmadd231ps_avx512vl(auVar131,auVar152,auVar123);
    auVar131 = vfmadd231ps_avx512vl(auVar134,auVar124,auVar152);
    auVar134 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar132 = vxorps_avx512vl(auVar118,auVar134);
    auVar133 = vxorps_avx512vl(ZEXT1632(auVar106),auVar134);
    auVar258._0_4_ = auVar133._0_4_ * fVar274;
    auVar258._4_4_ = auVar133._4_4_ * fVar276;
    auVar258._8_4_ = auVar133._8_4_ * fVar238;
    auVar258._12_4_ = auVar133._12_4_ * fVar289;
    auVar258._16_4_ = auVar133._16_4_ * 0.0;
    auVar258._20_4_ = auVar133._20_4_ * 0.0;
    auVar258._24_4_ = auVar133._24_4_ * 0.0;
    auVar258._28_4_ = 0;
    auVar138 = vmulps_avx512vl(auVar279._0_32_,auVar117);
    auVar117 = vsubps_avx(auVar258,auVar138);
    auVar159._4_4_ = auVar132._4_4_ * fVar275 * 0.5;
    auVar159._0_4_ = auVar132._0_4_ * fVar177 * 0.5;
    auVar159._8_4_ = auVar132._8_4_ * fVar254 * 0.5;
    auVar159._12_4_ = auVar132._12_4_ * fVar255 * 0.5;
    auVar159._16_4_ = auVar132._16_4_ * fVar290 * 0.5;
    auVar159._20_4_ = auVar132._20_4_ * fVar220 * 0.5;
    auVar159._24_4_ = auVar132._24_4_ * fVar19 * 0.5;
    auVar159._28_4_ = auVar118._28_4_;
    auVar160._4_4_ = auVar117._4_4_ * 0.5;
    auVar160._0_4_ = auVar117._0_4_ * 0.5;
    auVar160._8_4_ = auVar117._8_4_ * 0.5;
    auVar160._12_4_ = auVar117._12_4_ * 0.5;
    auVar160._16_4_ = auVar117._16_4_ * 0.5;
    auVar160._20_4_ = auVar117._20_4_ * 0.5;
    auVar160._24_4_ = auVar117._24_4_ * 0.5;
    auVar160._28_4_ = auVar117._28_4_;
    auVar38._4_4_ = (auVar138._4_4_ + fVar275 * fVar275) * 0.5;
    auVar38._0_4_ = (auVar138._0_4_ + fVar177 * fVar177) * 0.5;
    auVar38._8_4_ = (auVar138._8_4_ + fVar254 * fVar254) * 0.5;
    auVar38._12_4_ = (auVar138._12_4_ + fVar255 * fVar255) * 0.5;
    auVar38._16_4_ = (auVar138._16_4_ + fVar290 * fVar290) * 0.5;
    auVar38._20_4_ = (auVar138._20_4_ + fVar220 * fVar220) * 0.5;
    auVar38._24_4_ = (auVar138._24_4_ + fVar19 * fVar19) * 0.5;
    auVar38._28_4_ = auVar138._28_4_ + auVar269._28_4_;
    fVar177 = fVar274 * fVar274 * 0.5;
    fVar274 = fVar276 * fVar276 * 0.5;
    fVar275 = fVar238 * fVar238 * 0.5;
    fVar276 = fVar289 * fVar289 * 0.5;
    auVar39._28_4_ = auVar273._28_4_;
    auVar39._0_28_ = ZEXT1628(CONCAT412(fVar276,CONCAT48(fVar275,CONCAT44(fVar274,fVar177))));
    auVar117 = vmulps_avx512vl(local_5a0,auVar39);
    auVar40._4_4_ = local_5c0._4_4_ * fVar274;
    auVar40._0_4_ = local_5c0._0_4_ * fVar177;
    auVar40._8_4_ = local_5c0._8_4_ * fVar275;
    auVar40._12_4_ = local_5c0._12_4_ * fVar276;
    auVar40._16_4_ = local_5c0._16_4_ * 0.0;
    auVar40._20_4_ = local_5c0._20_4_ * 0.0;
    auVar40._24_4_ = local_5c0._24_4_ * 0.0;
    auVar40._28_4_ = auVar133._28_4_;
    auVar118 = vmulps_avx512vl(local_5e0,auVar39);
    auVar41._4_4_ = fVar274 * local_600._4_4_;
    auVar41._0_4_ = fVar177 * local_600._0_4_;
    auVar41._8_4_ = fVar275 * local_600._8_4_;
    auVar41._12_4_ = fVar276 * local_600._12_4_;
    auVar41._16_4_ = local_600._16_4_ * 0.0;
    auVar41._20_4_ = local_600._20_4_ * 0.0;
    auVar41._24_4_ = local_600._24_4_ * 0.0;
    auVar41._28_4_ = auVar273._28_4_;
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar38,auVar128);
    auVar132 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar129);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar38,auVar130);
    auVar106 = vfmadd231ps_fma(auVar41,auVar119,auVar38);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar160,auVar125);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar160,auVar121);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar160,auVar126);
    auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar106),auVar127,auVar160);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar159,auVar122);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar159,auVar120);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar159,auVar123);
    auVar133 = vfmadd231ps_avx512vl(auVar133,auVar124,auVar159);
    auVar42._4_4_ = auVar117._4_4_ * fVar20;
    auVar42._0_4_ = auVar117._0_4_ * fVar20;
    auVar42._8_4_ = auVar117._8_4_ * fVar20;
    auVar42._12_4_ = auVar117._12_4_ * fVar20;
    auVar42._16_4_ = auVar117._16_4_ * fVar20;
    auVar42._20_4_ = auVar117._20_4_ * fVar20;
    auVar42._24_4_ = auVar117._24_4_ * fVar20;
    auVar42._28_4_ = auVar119._28_4_;
    auVar286 = ZEXT3264(auVar42);
    auVar43._4_4_ = auVar132._4_4_ * fVar20;
    auVar43._0_4_ = auVar132._0_4_ * fVar20;
    auVar43._8_4_ = auVar132._8_4_ * fVar20;
    auVar43._12_4_ = auVar132._12_4_ * fVar20;
    auVar43._16_4_ = auVar132._16_4_ * fVar20;
    auVar43._20_4_ = auVar132._20_4_ * fVar20;
    auVar43._24_4_ = auVar132._24_4_ * fVar20;
    auVar43._28_4_ = 0x3e2aaaab;
    auVar44._4_4_ = auVar118._4_4_ * fVar20;
    auVar44._0_4_ = auVar118._0_4_ * fVar20;
    auVar44._8_4_ = auVar118._8_4_ * fVar20;
    auVar44._12_4_ = auVar118._12_4_ * fVar20;
    auVar44._16_4_ = auVar118._16_4_ * fVar20;
    auVar44._20_4_ = auVar118._20_4_ * fVar20;
    auVar44._24_4_ = auVar118._24_4_ * fVar20;
    auVar44._28_4_ = 0x40c00000;
    fVar177 = auVar133._0_4_ * fVar20;
    fVar274 = auVar133._4_4_ * fVar20;
    auVar45._4_4_ = fVar274;
    auVar45._0_4_ = fVar177;
    fVar275 = auVar133._8_4_ * fVar20;
    auVar45._8_4_ = fVar275;
    fVar276 = auVar133._12_4_ * fVar20;
    auVar45._12_4_ = fVar276;
    fVar254 = auVar133._16_4_ * fVar20;
    auVar45._16_4_ = fVar254;
    fVar238 = auVar133._20_4_ * fVar20;
    auVar45._20_4_ = fVar238;
    fVar255 = auVar133._24_4_ * fVar20;
    auVar45._24_4_ = fVar255;
    auVar45._28_4_ = fVar20;
    auVar106 = vxorps_avx512vl(auVar291._0_16_,auVar291._0_16_);
    auVar138 = vpermt2ps_avx512vl(auVar135,_DAT_01fb9fc0,ZEXT1632(auVar106));
    auVar278 = ZEXT3264(auVar138);
    auVar139 = vpermt2ps_avx512vl(auVar136,_DAT_01fb9fc0,ZEXT1632(auVar106));
    auVar280 = ZEXT3264(auVar139);
    auVar132 = ZEXT1632(auVar106);
    auVar140 = vpermt2ps_avx512vl(auVar137,_DAT_01fb9fc0,auVar132);
    auVar282 = ZEXT3264(auVar140);
    auVar259._0_4_ = fVar177 + auVar131._0_4_;
    auVar259._4_4_ = fVar274 + auVar131._4_4_;
    auVar259._8_4_ = fVar275 + auVar131._8_4_;
    auVar259._12_4_ = fVar276 + auVar131._12_4_;
    auVar259._16_4_ = fVar254 + auVar131._16_4_;
    auVar259._20_4_ = fVar238 + auVar131._20_4_;
    auVar259._24_4_ = fVar255 + auVar131._24_4_;
    auVar259._28_4_ = fVar20 + auVar131._28_4_;
    auVar117 = vmaxps_avx(auVar131,auVar259);
    auVar118 = vminps_avx(auVar131,auVar259);
    auVar141 = vpermt2ps_avx512vl(auVar131,_DAT_01fb9fc0,auVar132);
    auVar142 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar132);
    auVar143 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9fc0,auVar132);
    auVar156 = ZEXT1632(auVar106);
    auVar144 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar156);
    auVar131 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9fc0,auVar156);
    auVar145 = vsubps_avx512vl(auVar141,auVar131);
    auVar131 = vsubps_avx(auVar138,auVar135);
    auVar273 = ZEXT3264(auVar131);
    auVar132 = vsubps_avx(auVar139,auVar136);
    auVar269 = ZEXT3264(auVar132);
    auVar133 = vsubps_avx(auVar140,auVar137);
    auVar146 = vmulps_avx512vl(auVar132,auVar44);
    auVar146 = vfmsub231ps_avx512vl(auVar146,auVar43,auVar133);
    auVar147 = vmulps_avx512vl(auVar133,auVar42);
    auVar147 = vfmsub231ps_avx512vl(auVar147,auVar44,auVar131);
    auVar148 = vmulps_avx512vl(auVar131,auVar43);
    auVar148 = vfmsub231ps_avx512vl(auVar148,auVar42,auVar132);
    auVar148 = vmulps_avx512vl(auVar148,auVar148);
    auVar147 = vfmadd231ps_avx512vl(auVar148,auVar147,auVar147);
    auVar146 = vfmadd231ps_avx512vl(auVar147,auVar146,auVar146);
    auVar147 = vmulps_avx512vl(auVar133,auVar133);
    auVar147 = vfmadd231ps_avx512vl(auVar147,auVar132,auVar132);
    auVar148 = vfmadd231ps_avx512vl(auVar147,auVar131,auVar131);
    auVar147 = vrcp14ps_avx512vl(auVar148);
    auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar150 = vfnmadd213ps_avx512vl(auVar147,auVar148,auVar149);
    auVar147 = vfmadd132ps_avx512vl(auVar150,auVar147,auVar147);
    auVar146 = vmulps_avx512vl(auVar146,auVar147);
    auVar150 = vmulps_avx512vl(auVar132,auVar144);
    auVar150 = vfmsub231ps_avx512vl(auVar150,auVar143,auVar133);
    auVar151 = vmulps_avx512vl(auVar133,auVar142);
    auVar151 = vfmsub231ps_avx512vl(auVar151,auVar144,auVar131);
    auVar152 = vmulps_avx512vl(auVar131,auVar143);
    auVar152 = vfmsub231ps_avx512vl(auVar152,auVar142,auVar132);
    auVar152 = vmulps_avx512vl(auVar152,auVar152);
    auVar151 = vfmadd231ps_avx512vl(auVar152,auVar151,auVar151);
    auVar150 = vfmadd231ps_avx512vl(auVar151,auVar150,auVar150);
    auVar147 = vmulps_avx512vl(auVar150,auVar147);
    auVar146 = vmaxps_avx512vl(auVar146,auVar147);
    auVar146 = vsqrtps_avx512vl(auVar146);
    auVar147 = vmaxps_avx512vl(auVar145,auVar141);
    auVar117 = vmaxps_avx512vl(auVar117,auVar147);
    auVar150 = vaddps_avx512vl(auVar146,auVar117);
    auVar117 = vminps_avx512vl(auVar145,auVar141);
    auVar117 = vminps_avx(auVar118,auVar117);
    auVar117 = vsubps_avx512vl(auVar117,auVar146);
    auVar145._8_4_ = 0x3f800002;
    auVar145._0_8_ = 0x3f8000023f800002;
    auVar145._12_4_ = 0x3f800002;
    auVar145._16_4_ = 0x3f800002;
    auVar145._20_4_ = 0x3f800002;
    auVar145._24_4_ = 0x3f800002;
    auVar145._28_4_ = 0x3f800002;
    auVar118 = vmulps_avx512vl(auVar150,auVar145);
    auVar146._8_4_ = 0x3f7ffffc;
    auVar146._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar146._12_4_ = 0x3f7ffffc;
    auVar146._16_4_ = 0x3f7ffffc;
    auVar146._20_4_ = 0x3f7ffffc;
    auVar146._24_4_ = 0x3f7ffffc;
    auVar146._28_4_ = 0x3f7ffffc;
    auVar117 = vmulps_avx512vl(auVar117,auVar146);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar141 = vrsqrt14ps_avx512vl(auVar148);
    auVar147._8_4_ = 0xbf000000;
    auVar147._0_8_ = 0xbf000000bf000000;
    auVar147._12_4_ = 0xbf000000;
    auVar147._16_4_ = 0xbf000000;
    auVar147._20_4_ = 0xbf000000;
    auVar147._24_4_ = 0xbf000000;
    auVar147._28_4_ = 0xbf000000;
    auVar145 = vmulps_avx512vl(auVar148,auVar147);
    fVar177 = auVar141._0_4_;
    fVar274 = auVar141._4_4_;
    fVar275 = auVar141._8_4_;
    fVar276 = auVar141._12_4_;
    fVar254 = auVar141._16_4_;
    fVar238 = auVar141._20_4_;
    fVar255 = auVar141._24_4_;
    auVar46._4_4_ = fVar274 * fVar274 * fVar274 * auVar145._4_4_;
    auVar46._0_4_ = fVar177 * fVar177 * fVar177 * auVar145._0_4_;
    auVar46._8_4_ = fVar275 * fVar275 * fVar275 * auVar145._8_4_;
    auVar46._12_4_ = fVar276 * fVar276 * fVar276 * auVar145._12_4_;
    auVar46._16_4_ = fVar254 * fVar254 * fVar254 * auVar145._16_4_;
    auVar46._20_4_ = fVar238 * fVar238 * fVar238 * auVar145._20_4_;
    auVar46._24_4_ = fVar255 * fVar255 * fVar255 * auVar145._24_4_;
    auVar46._28_4_ = auVar150._28_4_;
    auVar148._8_4_ = 0x3fc00000;
    auVar148._0_8_ = 0x3fc000003fc00000;
    auVar148._12_4_ = 0x3fc00000;
    auVar148._16_4_ = 0x3fc00000;
    auVar148._20_4_ = 0x3fc00000;
    auVar148._24_4_ = 0x3fc00000;
    auVar148._28_4_ = 0x3fc00000;
    auVar141 = vfmadd231ps_avx512vl(auVar46,auVar141,auVar148);
    auVar145 = vmulps_avx512vl(auVar131,auVar141);
    auVar146 = vmulps_avx512vl(auVar132,auVar141);
    auVar147 = vmulps_avx512vl(auVar133,auVar141);
    auVar148 = vsubps_avx512vl(auVar156,auVar135);
    auVar151 = vsubps_avx512vl(auVar156,auVar136);
    auVar152 = vsubps_avx512vl(auVar156,auVar137);
    auVar150 = vmulps_avx512vl(local_840,auVar152);
    auVar150 = vfmadd231ps_avx512vl(auVar150,local_6c0,auVar151);
    auVar150 = vfmadd231ps_avx512vl(auVar150,local_820,auVar148);
    auVar153 = vmulps_avx512vl(auVar152,auVar152);
    auVar153 = vfmadd231ps_avx512vl(auVar153,auVar151,auVar151);
    auVar153 = vfmadd231ps_avx512vl(auVar153,auVar148,auVar148);
    auVar154 = vmulps_avx512vl(local_840,auVar147);
    auVar154 = vfmadd231ps_avx512vl(auVar154,auVar146,local_6c0);
    auVar154 = vfmadd231ps_avx512vl(auVar154,auVar145,local_820);
    auVar147 = vmulps_avx512vl(auVar152,auVar147);
    auVar146 = vfmadd231ps_avx512vl(auVar147,auVar151,auVar146);
    auVar145 = vfmadd231ps_avx512vl(auVar146,auVar148,auVar145);
    auVar146 = vmulps_avx512vl(auVar154,auVar154);
    auVar147 = vsubps_avx512vl(local_560,auVar146);
    auVar155 = vmulps_avx512vl(auVar154,auVar145);
    auVar150 = vsubps_avx512vl(auVar150,auVar155);
    auVar155 = vaddps_avx512vl(auVar150,auVar150);
    auVar150 = vmulps_avx512vl(auVar145,auVar145);
    local_a00 = vsubps_avx512vl(auVar153,auVar150);
    auVar118 = vsubps_avx512vl(local_a00,auVar118);
    auVar153 = vmulps_avx512vl(auVar155,auVar155);
    auVar150._8_4_ = 0x40800000;
    auVar150._0_8_ = 0x4080000040800000;
    auVar150._12_4_ = 0x40800000;
    auVar150._16_4_ = 0x40800000;
    auVar150._20_4_ = 0x40800000;
    auVar150._24_4_ = 0x40800000;
    auVar150._28_4_ = 0x40800000;
    _local_a80 = vmulps_avx512vl(auVar147,auVar150);
    auVar150 = vmulps_avx512vl(_local_a80,auVar118);
    auVar150 = vsubps_avx512vl(auVar153,auVar150);
    uVar102 = vcmpps_avx512vl(auVar150,auVar156,5);
    bVar91 = (byte)uVar102;
    if (bVar91 == 0) {
LAB_019df78b:
      auVar291 = ZEXT3264(auVar149);
      auVar194 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_7c0._0_32_ = auVar153;
      auVar150 = vsqrtps_avx512vl(auVar150);
      auVar156 = vaddps_avx512vl(auVar147,auVar147);
      local_aa0 = vrcp14ps_avx512vl(auVar156);
      auVar149 = vfnmadd213ps_avx512vl(local_aa0,auVar156,auVar149);
      auVar149 = vfmadd132ps_avx512vl(auVar149,local_aa0,local_aa0);
      _local_880 = vxorps_avx512vl(auVar155,auVar134);
      auVar134 = vsubps_avx512vl(_local_880,auVar150);
      local_860 = vmulps_avx512vl(auVar134,auVar149);
      auVar134 = vsubps_avx512vl(auVar150,auVar155);
      local_8a0 = vmulps_avx512vl(auVar134,auVar149);
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar150 = vblendmps_avx512vl(auVar134,local_860);
      auVar157._0_4_ =
           (uint)(bVar91 & 1) * auVar150._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar134._0_4_;
      bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar157._4_4_ = (uint)bVar101 * auVar150._4_4_ | (uint)!bVar101 * auVar134._4_4_;
      bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar157._8_4_ = (uint)bVar101 * auVar150._8_4_ | (uint)!bVar101 * auVar134._8_4_;
      bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar157._12_4_ = (uint)bVar101 * auVar150._12_4_ | (uint)!bVar101 * auVar134._12_4_;
      bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar157._16_4_ = (uint)bVar101 * auVar150._16_4_ | (uint)!bVar101 * auVar134._16_4_;
      bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar157._20_4_ = (uint)bVar101 * auVar150._20_4_ | (uint)!bVar101 * auVar134._20_4_;
      bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar157._24_4_ = (uint)bVar101 * auVar150._24_4_ | (uint)!bVar101 * auVar134._24_4_;
      bVar101 = SUB81(uVar102 >> 7,0);
      auVar157._28_4_ = (uint)bVar101 * auVar150._28_4_ | (uint)!bVar101 * auVar134._28_4_;
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar150 = vblendmps_avx512vl(auVar134,local_8a0);
      auVar158._0_4_ =
           (uint)(bVar91 & 1) * auVar150._0_4_ | (uint)!(bool)(bVar91 & 1) * auVar134._0_4_;
      bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
      auVar158._4_4_ = (uint)bVar101 * auVar150._4_4_ | (uint)!bVar101 * auVar134._4_4_;
      bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
      auVar158._8_4_ = (uint)bVar101 * auVar150._8_4_ | (uint)!bVar101 * auVar134._8_4_;
      bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
      auVar158._12_4_ = (uint)bVar101 * auVar150._12_4_ | (uint)!bVar101 * auVar134._12_4_;
      bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
      auVar158._16_4_ = (uint)bVar101 * auVar150._16_4_ | (uint)!bVar101 * auVar134._16_4_;
      bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
      auVar158._20_4_ = (uint)bVar101 * auVar150._20_4_ | (uint)!bVar101 * auVar134._20_4_;
      bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
      auVar158._24_4_ = (uint)bVar101 * auVar150._24_4_ | (uint)!bVar101 * auVar134._24_4_;
      bVar101 = SUB81(uVar102 >> 7,0);
      auVar158._28_4_ = (uint)bVar101 * auVar150._28_4_ | (uint)!bVar101 * auVar134._28_4_;
      auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar146,auVar134);
      local_8c0 = vmaxps_avx512vl(local_580,auVar134);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_8e0 = vmulps_avx512vl(local_8c0,auVar32);
      vandps_avx512vl(auVar147,auVar134);
      uVar96 = vcmpps_avx512vl(local_8e0,local_8e0,1);
      uVar102 = uVar102 & uVar96;
      bVar99 = (byte)uVar102;
      if (bVar99 != 0) {
        uVar96 = vcmpps_avx512vl(auVar118,_DAT_01f7b000,2);
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar146 = vblendmps_avx512vl(auVar118,auVar134);
        bVar97 = (byte)uVar96;
        uVar103 = (uint)(bVar97 & 1) * auVar146._0_4_ | (uint)!(bool)(bVar97 & 1) * local_8e0._0_4_;
        bVar101 = (bool)((byte)(uVar96 >> 1) & 1);
        uVar170 = (uint)bVar101 * auVar146._4_4_ | (uint)!bVar101 * local_8e0._4_4_;
        bVar101 = (bool)((byte)(uVar96 >> 2) & 1);
        uVar171 = (uint)bVar101 * auVar146._8_4_ | (uint)!bVar101 * local_8e0._8_4_;
        bVar101 = (bool)((byte)(uVar96 >> 3) & 1);
        uVar172 = (uint)bVar101 * auVar146._12_4_ | (uint)!bVar101 * local_8e0._12_4_;
        bVar101 = (bool)((byte)(uVar96 >> 4) & 1);
        uVar173 = (uint)bVar101 * auVar146._16_4_ | (uint)!bVar101 * local_8e0._16_4_;
        bVar101 = (bool)((byte)(uVar96 >> 5) & 1);
        uVar174 = (uint)bVar101 * auVar146._20_4_ | (uint)!bVar101 * local_8e0._20_4_;
        bVar101 = (bool)((byte)(uVar96 >> 6) & 1);
        uVar175 = (uint)bVar101 * auVar146._24_4_ | (uint)!bVar101 * local_8e0._24_4_;
        bVar101 = SUB81(uVar96 >> 7,0);
        uVar176 = (uint)bVar101 * auVar146._28_4_ | (uint)!bVar101 * local_8e0._28_4_;
        auVar157._0_4_ = (bVar99 & 1) * uVar103 | !(bool)(bVar99 & 1) * auVar157._0_4_;
        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
        auVar157._4_4_ = bVar101 * uVar170 | !bVar101 * auVar157._4_4_;
        bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
        auVar157._8_4_ = bVar101 * uVar171 | !bVar101 * auVar157._8_4_;
        bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
        auVar157._12_4_ = bVar101 * uVar172 | !bVar101 * auVar157._12_4_;
        bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
        auVar157._16_4_ = bVar101 * uVar173 | !bVar101 * auVar157._16_4_;
        bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
        auVar157._20_4_ = bVar101 * uVar174 | !bVar101 * auVar157._20_4_;
        bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
        auVar157._24_4_ = bVar101 * uVar175 | !bVar101 * auVar157._24_4_;
        bVar101 = SUB81(uVar102 >> 7,0);
        auVar157._28_4_ = bVar101 * uVar176 | !bVar101 * auVar157._28_4_;
        auVar118 = vblendmps_avx512vl(auVar134,auVar118);
        bVar101 = (bool)((byte)(uVar96 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar96 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar96 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar96 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar96 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar96 >> 6) & 1);
        bVar10 = SUB81(uVar96 >> 7,0);
        auVar158._0_4_ =
             (uint)(bVar99 & 1) *
             ((uint)(bVar97 & 1) * auVar118._0_4_ | !(bool)(bVar97 & 1) * uVar103) |
             !(bool)(bVar99 & 1) * auVar158._0_4_;
        bVar4 = (bool)((byte)(uVar102 >> 1) & 1);
        auVar158._4_4_ =
             (uint)bVar4 * ((uint)bVar101 * auVar118._4_4_ | !bVar101 * uVar170) |
             !bVar4 * auVar158._4_4_;
        bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
        auVar158._8_4_ =
             (uint)bVar101 * ((uint)bVar5 * auVar118._8_4_ | !bVar5 * uVar171) |
             !bVar101 * auVar158._8_4_;
        bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
        auVar158._12_4_ =
             (uint)bVar101 * ((uint)bVar6 * auVar118._12_4_ | !bVar6 * uVar172) |
             !bVar101 * auVar158._12_4_;
        bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
        auVar158._16_4_ =
             (uint)bVar101 * ((uint)bVar7 * auVar118._16_4_ | !bVar7 * uVar173) |
             !bVar101 * auVar158._16_4_;
        bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
        auVar158._20_4_ =
             (uint)bVar101 * ((uint)bVar8 * auVar118._20_4_ | !bVar8 * uVar174) |
             !bVar101 * auVar158._20_4_;
        bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
        auVar158._24_4_ =
             (uint)bVar101 * ((uint)bVar9 * auVar118._24_4_ | !bVar9 * uVar175) |
             !bVar101 * auVar158._24_4_;
        bVar101 = SUB81(uVar102 >> 7,0);
        auVar158._28_4_ =
             (uint)bVar101 * ((uint)bVar10 * auVar118._28_4_ | !bVar10 * uVar176) |
             !bVar101 * auVar158._28_4_;
        bVar91 = (~bVar99 | bVar97) & bVar91;
      }
      if ((bVar91 & 0x7f) == 0) {
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar291 = ZEXT3264(auVar117);
        auVar194 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar134 = vxorps_avx512vl(auVar144,auVar118);
        auVar142 = vxorps_avx512vl(auVar142,auVar118);
        uVar103 = *(uint *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
        auVar194 = ZEXT464(uVar103);
        auVar143 = vxorps_avx512vl(auVar143,auVar118);
        auVar106 = vsubss_avx512f(ZEXT416(uVar103),ZEXT416((uint)local_940._0_4_));
        auVar144 = vbroadcastss_avx512vl(auVar106);
        auVar144 = vminps_avx512vl(auVar144,auVar158);
        auVar90._4_4_ = fStack_61c;
        auVar90._0_4_ = local_620;
        auVar90._8_4_ = fStack_618;
        auVar90._12_4_ = fStack_614;
        auVar90._16_4_ = fStack_610;
        auVar90._20_4_ = fStack_60c;
        auVar90._24_4_ = fStack_608;
        auVar90._28_4_ = fStack_604;
        auVar146 = vmaxps_avx512vl(auVar90,auVar157);
        auVar147 = vmulps_avx512vl(auVar44,auVar152);
        auVar147 = vfmadd213ps_avx512vl(auVar151,auVar43,auVar147);
        auVar106 = vfmadd213ps_fma(auVar148,auVar42,auVar147);
        auVar147 = vmulps_avx512vl(local_840,auVar44);
        auVar147 = vfmadd231ps_avx512vl(auVar147,local_6c0,auVar43);
        auVar147 = vfmadd231ps_avx512vl(auVar147,local_820,auVar42);
        auVar148 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar147,auVar148);
        auVar150 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar21 = vcmpps_avx512vl(auVar148,auVar150,1);
        auVar151 = vxorps_avx512vl(ZEXT1632(auVar106),auVar118);
        auVar152 = vrcp14ps_avx512vl(auVar147);
        auVar159 = vxorps_avx512vl(auVar147,auVar118);
        auVar149 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar160 = vfnmadd213ps_avx512vl(auVar152,auVar147,auVar149);
        auVar106 = vfmadd132ps_fma(auVar160,auVar152,auVar152);
        fVar177 = auVar106._0_4_ * auVar151._0_4_;
        fVar274 = auVar106._4_4_ * auVar151._4_4_;
        auVar47._4_4_ = fVar274;
        auVar47._0_4_ = fVar177;
        fVar275 = auVar106._8_4_ * auVar151._8_4_;
        auVar47._8_4_ = fVar275;
        fVar276 = auVar106._12_4_ * auVar151._12_4_;
        auVar47._12_4_ = fVar276;
        fVar254 = auVar151._16_4_ * 0.0;
        auVar47._16_4_ = fVar254;
        fVar238 = auVar151._20_4_ * 0.0;
        auVar47._20_4_ = fVar238;
        fVar255 = auVar151._24_4_ * 0.0;
        auVar47._24_4_ = fVar255;
        auVar47._28_4_ = auVar151._28_4_;
        uVar23 = vcmpps_avx512vl(auVar147,auVar159,1);
        bVar99 = (byte)uVar21 | (byte)uVar23;
        auVar287._8_4_ = 0xff800000;
        auVar287._0_8_ = 0xff800000ff800000;
        auVar287._12_4_ = 0xff800000;
        auVar287._16_4_ = 0xff800000;
        auVar287._20_4_ = 0xff800000;
        auVar287._24_4_ = 0xff800000;
        auVar287._28_4_ = 0xff800000;
        auVar160 = vblendmps_avx512vl(auVar47,auVar287);
        auVar161._0_4_ =
             (uint)(bVar99 & 1) * auVar160._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar152._0_4_;
        bVar101 = (bool)(bVar99 >> 1 & 1);
        auVar161._4_4_ = (uint)bVar101 * auVar160._4_4_ | (uint)!bVar101 * auVar152._4_4_;
        bVar101 = (bool)(bVar99 >> 2 & 1);
        auVar161._8_4_ = (uint)bVar101 * auVar160._8_4_ | (uint)!bVar101 * auVar152._8_4_;
        bVar101 = (bool)(bVar99 >> 3 & 1);
        auVar161._12_4_ = (uint)bVar101 * auVar160._12_4_ | (uint)!bVar101 * auVar152._12_4_;
        bVar101 = (bool)(bVar99 >> 4 & 1);
        auVar161._16_4_ = (uint)bVar101 * auVar160._16_4_ | (uint)!bVar101 * auVar152._16_4_;
        bVar101 = (bool)(bVar99 >> 5 & 1);
        auVar161._20_4_ = (uint)bVar101 * auVar160._20_4_ | (uint)!bVar101 * auVar152._20_4_;
        bVar101 = (bool)(bVar99 >> 6 & 1);
        auVar161._24_4_ = (uint)bVar101 * auVar160._24_4_ | (uint)!bVar101 * auVar152._24_4_;
        auVar161._28_4_ =
             (uint)(bVar99 >> 7) * auVar160._28_4_ | (uint)!(bool)(bVar99 >> 7) * auVar152._28_4_;
        auVar146 = vmaxps_avx512vl(auVar146,auVar161);
        auVar286 = ZEXT3264(auVar146);
        uVar23 = vcmpps_avx512vl(auVar147,auVar159,6);
        bVar99 = (byte)uVar21 | (byte)uVar23;
        auVar147 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar162._0_4_ =
             (uint)(bVar99 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar99 & 1) * (int)fVar177;
        bVar101 = (bool)(bVar99 >> 1 & 1);
        auVar162._4_4_ = (uint)bVar101 * auVar147._4_4_ | (uint)!bVar101 * (int)fVar274;
        bVar101 = (bool)(bVar99 >> 2 & 1);
        auVar162._8_4_ = (uint)bVar101 * auVar147._8_4_ | (uint)!bVar101 * (int)fVar275;
        bVar101 = (bool)(bVar99 >> 3 & 1);
        auVar162._12_4_ = (uint)bVar101 * auVar147._12_4_ | (uint)!bVar101 * (int)fVar276;
        bVar101 = (bool)(bVar99 >> 4 & 1);
        auVar162._16_4_ = (uint)bVar101 * auVar147._16_4_ | (uint)!bVar101 * (int)fVar254;
        bVar101 = (bool)(bVar99 >> 5 & 1);
        auVar162._20_4_ = (uint)bVar101 * auVar147._20_4_ | (uint)!bVar101 * (int)fVar238;
        bVar101 = (bool)(bVar99 >> 6 & 1);
        auVar162._24_4_ = (uint)bVar101 * auVar147._24_4_ | (uint)!bVar101 * (int)fVar255;
        auVar162._28_4_ =
             (uint)(bVar99 >> 7) * auVar147._28_4_ | (uint)!(bool)(bVar99 >> 7) * auVar151._28_4_;
        auVar151 = vminps_avx512vl(auVar144,auVar162);
        auVar106 = vxorps_avx512vl(auVar144._0_16_,auVar144._0_16_);
        auVar138 = vsubps_avx512vl(ZEXT1632(auVar106),auVar138);
        auVar139 = vsubps_avx512vl(ZEXT1632(auVar106),auVar139);
        auVar144 = ZEXT1632(auVar106);
        auVar140 = vsubps_avx512vl(auVar144,auVar140);
        auVar140 = vmulps_avx512vl(auVar140,auVar134);
        auVar139 = vfmadd231ps_avx512vl(auVar140,auVar143,auVar139);
        auVar138 = vfmadd231ps_avx512vl(auVar139,auVar142,auVar138);
        auVar134 = vmulps_avx512vl(local_840,auVar134);
        auVar134 = vfmadd231ps_avx512vl(auVar134,local_6c0,auVar143);
        auVar134 = vfmadd231ps_avx512vl(auVar134,local_820,auVar142);
        vandps_avx512vl(auVar134,auVar148);
        uVar21 = vcmpps_avx512vl(auVar134,auVar150,1);
        auVar138 = vxorps_avx512vl(auVar138,auVar118);
        auVar139 = vrcp14ps_avx512vl(auVar134);
        auVar118 = vxorps_avx512vl(auVar134,auVar118);
        auVar282 = ZEXT3264(auVar118);
        auVar140 = vfnmadd213ps_avx512vl(auVar139,auVar134,auVar149);
        auVar106 = vfmadd132ps_fma(auVar140,auVar139,auVar139);
        fVar177 = auVar106._0_4_ * auVar138._0_4_;
        fVar274 = auVar106._4_4_ * auVar138._4_4_;
        auVar48._4_4_ = fVar274;
        auVar48._0_4_ = fVar177;
        fVar275 = auVar106._8_4_ * auVar138._8_4_;
        auVar48._8_4_ = fVar275;
        fVar276 = auVar106._12_4_ * auVar138._12_4_;
        auVar48._12_4_ = fVar276;
        fVar254 = auVar138._16_4_ * 0.0;
        auVar48._16_4_ = fVar254;
        fVar238 = auVar138._20_4_ * 0.0;
        auVar48._20_4_ = fVar238;
        fVar255 = auVar138._24_4_ * 0.0;
        auVar48._24_4_ = fVar255;
        auVar48._28_4_ = auVar138._28_4_;
        uVar23 = vcmpps_avx512vl(auVar134,auVar118,1);
        bVar99 = (byte)uVar21 | (byte)uVar23;
        auVar140 = vblendmps_avx512vl(auVar48,auVar287);
        auVar163._0_4_ =
             (uint)(bVar99 & 1) * auVar140._0_4_ | (uint)!(bool)(bVar99 & 1) * auVar139._0_4_;
        bVar101 = (bool)(bVar99 >> 1 & 1);
        auVar163._4_4_ = (uint)bVar101 * auVar140._4_4_ | (uint)!bVar101 * auVar139._4_4_;
        bVar101 = (bool)(bVar99 >> 2 & 1);
        auVar163._8_4_ = (uint)bVar101 * auVar140._8_4_ | (uint)!bVar101 * auVar139._8_4_;
        bVar101 = (bool)(bVar99 >> 3 & 1);
        auVar163._12_4_ = (uint)bVar101 * auVar140._12_4_ | (uint)!bVar101 * auVar139._12_4_;
        bVar101 = (bool)(bVar99 >> 4 & 1);
        auVar163._16_4_ = (uint)bVar101 * auVar140._16_4_ | (uint)!bVar101 * auVar139._16_4_;
        bVar101 = (bool)(bVar99 >> 5 & 1);
        auVar163._20_4_ = (uint)bVar101 * auVar140._20_4_ | (uint)!bVar101 * auVar139._20_4_;
        bVar101 = (bool)(bVar99 >> 6 & 1);
        auVar163._24_4_ = (uint)bVar101 * auVar140._24_4_ | (uint)!bVar101 * auVar139._24_4_;
        auVar163._28_4_ =
             (uint)(bVar99 >> 7) * auVar140._28_4_ | (uint)!(bool)(bVar99 >> 7) * auVar139._28_4_;
        local_800 = vmaxps_avx(auVar146,auVar163);
        auVar280 = ZEXT3264(local_800);
        uVar23 = vcmpps_avx512vl(auVar134,auVar118,6);
        bVar99 = (byte)uVar21 | (byte)uVar23;
        auVar164._0_4_ =
             (uint)(bVar99 & 1) * auVar147._0_4_ | (uint)!(bool)(bVar99 & 1) * (int)fVar177;
        bVar101 = (bool)(bVar99 >> 1 & 1);
        auVar164._4_4_ = (uint)bVar101 * auVar147._4_4_ | (uint)!bVar101 * (int)fVar274;
        bVar101 = (bool)(bVar99 >> 2 & 1);
        auVar164._8_4_ = (uint)bVar101 * auVar147._8_4_ | (uint)!bVar101 * (int)fVar275;
        bVar101 = (bool)(bVar99 >> 3 & 1);
        auVar164._12_4_ = (uint)bVar101 * auVar147._12_4_ | (uint)!bVar101 * (int)fVar276;
        bVar101 = (bool)(bVar99 >> 4 & 1);
        auVar164._16_4_ = (uint)bVar101 * auVar147._16_4_ | (uint)!bVar101 * (int)fVar254;
        bVar101 = (bool)(bVar99 >> 5 & 1);
        auVar164._20_4_ = (uint)bVar101 * auVar147._20_4_ | (uint)!bVar101 * (int)fVar238;
        bVar101 = (bool)(bVar99 >> 6 & 1);
        auVar164._24_4_ = (uint)bVar101 * auVar147._24_4_ | (uint)!bVar101 * (int)fVar255;
        auVar164._28_4_ =
             (uint)(bVar99 >> 7) * auVar147._28_4_ | (uint)!(bool)(bVar99 >> 7) * auVar138._28_4_;
        local_680 = vminps_avx(auVar151,auVar164);
        auVar278 = ZEXT3264(local_680);
        uVar21 = vcmpps_avx512vl(local_800,local_680,2);
        bVar91 = bVar91 & 0x7f & (byte)uVar21;
        if (bVar91 == 0) goto LAB_019df78b;
        auVar118 = vmaxps_avx512vl(auVar144,auVar117);
        auVar117 = vfmadd213ps_avx512vl(local_860,auVar154,auVar145);
        fVar177 = auVar141._0_4_;
        fVar274 = auVar141._4_4_;
        auVar49._4_4_ = fVar274 * auVar117._4_4_;
        auVar49._0_4_ = fVar177 * auVar117._0_4_;
        fVar275 = auVar141._8_4_;
        auVar49._8_4_ = fVar275 * auVar117._8_4_;
        fVar276 = auVar141._12_4_;
        auVar49._12_4_ = fVar276 * auVar117._12_4_;
        fVar254 = auVar141._16_4_;
        auVar49._16_4_ = fVar254 * auVar117._16_4_;
        fVar238 = auVar141._20_4_;
        auVar49._20_4_ = fVar238 * auVar117._20_4_;
        fVar255 = auVar141._24_4_;
        auVar49._24_4_ = fVar255 * auVar117._24_4_;
        auVar49._28_4_ = auVar117._28_4_;
        auVar117 = vfmadd213ps_avx512vl(local_8a0,auVar154,auVar145);
        auVar50._4_4_ = fVar274 * auVar117._4_4_;
        auVar50._0_4_ = fVar177 * auVar117._0_4_;
        auVar50._8_4_ = fVar275 * auVar117._8_4_;
        auVar50._12_4_ = fVar276 * auVar117._12_4_;
        auVar50._16_4_ = fVar254 * auVar117._16_4_;
        auVar50._20_4_ = fVar238 * auVar117._20_4_;
        auVar50._24_4_ = fVar255 * auVar117._24_4_;
        auVar50._28_4_ = auVar117._28_4_;
        auVar117 = vminps_avx512vl(auVar49,auVar149);
        auVar134 = ZEXT832(0) << 0x20;
        auVar117 = vmaxps_avx(auVar117,ZEXT832(0) << 0x20);
        auVar138 = vminps_avx512vl(auVar50,auVar149);
        auVar51._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar117._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar51,auVar185,local_a60);
        auVar117 = vmaxps_avx(auVar138,ZEXT832(0) << 0x20);
        auVar52._4_4_ = (auVar117._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar117._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar117._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar117._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar117._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar117._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar117._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar117._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar52,auVar185,local_a60);
        auVar53._4_4_ = auVar118._4_4_ * auVar118._4_4_;
        auVar53._0_4_ = auVar118._0_4_ * auVar118._0_4_;
        auVar53._8_4_ = auVar118._8_4_ * auVar118._8_4_;
        auVar53._12_4_ = auVar118._12_4_ * auVar118._12_4_;
        auVar53._16_4_ = auVar118._16_4_ * auVar118._16_4_;
        auVar53._20_4_ = auVar118._20_4_ * auVar118._20_4_;
        auVar53._24_4_ = auVar118._24_4_ * auVar118._24_4_;
        auVar53._28_4_ = auVar118._28_4_;
        auVar117 = vsubps_avx(local_a00,auVar53);
        auVar286 = ZEXT3264(auVar117);
        auVar54._4_4_ = auVar117._4_4_ * (float)local_a80._4_4_;
        auVar54._0_4_ = auVar117._0_4_ * (float)local_a80._0_4_;
        auVar54._8_4_ = auVar117._8_4_ * fStack_a78;
        auVar54._12_4_ = auVar117._12_4_ * fStack_a74;
        auVar54._16_4_ = auVar117._16_4_ * fStack_a70;
        auVar54._20_4_ = auVar117._20_4_ * fStack_a6c;
        auVar54._24_4_ = auVar117._24_4_ * fStack_a68;
        auVar54._28_4_ = auVar118._28_4_;
        auVar118 = vsubps_avx(auVar153,auVar54);
        uVar21 = vcmpps_avx512vl(auVar118,ZEXT832(0) << 0x20,5);
        bVar99 = (byte)uVar21;
        if (bVar99 == 0) {
          bVar99 = 0;
          auVar131 = ZEXT832(0) << 0x20;
          auVar132 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar118 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar138 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar280 = ZEXT864(0) << 0x20;
          auVar165._8_4_ = 0x7f800000;
          auVar165._0_8_ = 0x7f8000007f800000;
          auVar165._12_4_ = 0x7f800000;
          auVar165._16_4_ = 0x7f800000;
          auVar165._20_4_ = 0x7f800000;
          auVar165._24_4_ = 0x7f800000;
          auVar165._28_4_ = 0x7f800000;
          auVar166._8_4_ = 0xff800000;
          auVar166._0_8_ = 0xff800000ff800000;
          auVar166._12_4_ = 0xff800000;
          auVar166._16_4_ = 0xff800000;
          auVar166._20_4_ = 0xff800000;
          auVar166._24_4_ = 0xff800000;
          auVar166._28_4_ = 0xff800000;
        }
        else {
          auVar107 = vxorps_avx512vl(auVar148._0_16_,auVar148._0_16_);
          uVar102 = vcmpps_avx512vl(auVar118,auVar144,5);
          auVar118 = vsqrtps_avx(auVar118);
          auVar134 = vfnmadd213ps_avx512vl(auVar156,local_aa0,auVar149);
          auVar139 = vfmadd132ps_avx512vl(auVar134,local_aa0,local_aa0);
          auVar134 = vsubps_avx(_local_880,auVar118);
          auVar140 = vmulps_avx512vl(auVar134,auVar139);
          auVar118 = vsubps_avx512vl(auVar118,auVar155);
          auVar139 = vmulps_avx512vl(auVar118,auVar139);
          auVar118 = vfmadd213ps_avx512vl(auVar154,auVar140,auVar145);
          auVar55._4_4_ = fVar274 * auVar118._4_4_;
          auVar55._0_4_ = fVar177 * auVar118._0_4_;
          auVar55._8_4_ = fVar275 * auVar118._8_4_;
          auVar55._12_4_ = fVar276 * auVar118._12_4_;
          auVar55._16_4_ = fVar254 * auVar118._16_4_;
          auVar55._20_4_ = fVar238 * auVar118._20_4_;
          auVar55._24_4_ = fVar255 * auVar118._24_4_;
          auVar55._28_4_ = auVar138._28_4_;
          auVar118 = vmulps_avx512vl(local_820,auVar140);
          auVar134 = vmulps_avx512vl(local_6c0,auVar140);
          auVar142 = vmulps_avx512vl(local_840,auVar140);
          auVar138 = vfmadd213ps_avx512vl(auVar131,auVar55,auVar135);
          auVar118 = vsubps_avx512vl(auVar118,auVar138);
          auVar138 = vfmadd213ps_avx512vl(auVar132,auVar55,auVar136);
          auVar138 = vsubps_avx512vl(auVar134,auVar138);
          auVar106 = vfmadd213ps_fma(auVar55,auVar133,auVar137);
          auVar134 = vsubps_avx(auVar142,ZEXT1632(auVar106));
          auVar280 = ZEXT3264(auVar134);
          auVar134 = vfmadd213ps_avx512vl(auVar154,auVar139,auVar145);
          auVar141 = vmulps_avx512vl(auVar141,auVar134);
          auVar134 = vmulps_avx512vl(local_820,auVar139);
          auVar142 = vmulps_avx512vl(local_6c0,auVar139);
          auVar143 = vmulps_avx512vl(local_840,auVar139);
          auVar106 = vfmadd213ps_fma(auVar131,auVar141,auVar135);
          auVar134 = vsubps_avx(auVar134,ZEXT1632(auVar106));
          auVar106 = vfmadd213ps_fma(auVar132,auVar141,auVar136);
          auVar131 = vsubps_avx512vl(auVar142,ZEXT1632(auVar106));
          auVar106 = vfmadd213ps_fma(auVar133,auVar141,auVar137);
          auVar132 = vsubps_avx512vl(auVar143,ZEXT1632(auVar106));
          auVar186._8_4_ = 0x7f800000;
          auVar186._0_8_ = 0x7f8000007f800000;
          auVar186._12_4_ = 0x7f800000;
          auVar186._16_4_ = 0x7f800000;
          auVar186._20_4_ = 0x7f800000;
          auVar186._24_4_ = 0x7f800000;
          auVar186._28_4_ = 0x7f800000;
          auVar133 = vblendmps_avx512vl(auVar186,auVar140);
          bVar101 = (bool)((byte)uVar102 & 1);
          auVar165._0_4_ = (uint)bVar101 * auVar133._0_4_ | (uint)!bVar101 * auVar135._0_4_;
          bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar165._4_4_ = (uint)bVar101 * auVar133._4_4_ | (uint)!bVar101 * auVar135._4_4_;
          bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar165._8_4_ = (uint)bVar101 * auVar133._8_4_ | (uint)!bVar101 * auVar135._8_4_;
          bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar165._12_4_ = (uint)bVar101 * auVar133._12_4_ | (uint)!bVar101 * auVar135._12_4_;
          bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar165._16_4_ = (uint)bVar101 * auVar133._16_4_ | (uint)!bVar101 * auVar135._16_4_;
          bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar165._20_4_ = (uint)bVar101 * auVar133._20_4_ | (uint)!bVar101 * auVar135._20_4_;
          bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar165._24_4_ = (uint)bVar101 * auVar133._24_4_ | (uint)!bVar101 * auVar135._24_4_;
          bVar101 = SUB81(uVar102 >> 7,0);
          auVar165._28_4_ = (uint)bVar101 * auVar133._28_4_ | (uint)!bVar101 * auVar135._28_4_;
          auVar187._8_4_ = 0xff800000;
          auVar187._0_8_ = 0xff800000ff800000;
          auVar187._12_4_ = 0xff800000;
          auVar187._16_4_ = 0xff800000;
          auVar187._20_4_ = 0xff800000;
          auVar187._24_4_ = 0xff800000;
          auVar187._28_4_ = 0xff800000;
          auVar133 = vblendmps_avx512vl(auVar187,auVar139);
          bVar101 = (bool)((byte)uVar102 & 1);
          auVar166._0_4_ = (uint)bVar101 * auVar133._0_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
          auVar166._4_4_ = (uint)bVar101 * auVar133._4_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
          auVar166._8_4_ = (uint)bVar101 * auVar133._8_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
          auVar166._12_4_ = (uint)bVar101 * auVar133._12_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
          auVar166._16_4_ = (uint)bVar101 * auVar133._16_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
          auVar166._20_4_ = (uint)bVar101 * auVar133._20_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
          auVar166._24_4_ = (uint)bVar101 * auVar133._24_4_ | (uint)!bVar101 * -0x800000;
          bVar101 = SUB81(uVar102 >> 7,0);
          auVar166._28_4_ = (uint)bVar101 * auVar133._28_4_ | (uint)!bVar101 * -0x800000;
          auVar33._8_4_ = 0x36000000;
          auVar33._0_8_ = 0x3600000036000000;
          auVar33._12_4_ = 0x36000000;
          auVar33._16_4_ = 0x36000000;
          auVar33._20_4_ = 0x36000000;
          auVar33._24_4_ = 0x36000000;
          auVar33._28_4_ = 0x36000000;
          auVar133 = vmulps_avx512vl(local_8c0,auVar33);
          uVar96 = vcmpps_avx512vl(auVar133,local_8e0,0xe);
          uVar102 = uVar102 & uVar96;
          bVar97 = (byte)uVar102;
          if (bVar97 != 0) {
            uVar96 = vcmpps_avx512vl(auVar117,ZEXT1632(auVar107),2);
            auVar272._8_4_ = 0x7f800000;
            auVar272._0_8_ = 0x7f8000007f800000;
            auVar272._12_4_ = 0x7f800000;
            auVar272._16_4_ = 0x7f800000;
            auVar272._20_4_ = 0x7f800000;
            auVar272._24_4_ = 0x7f800000;
            auVar272._28_4_ = 0x7f800000;
            auVar285._8_4_ = 0xff800000;
            auVar285._0_8_ = 0xff800000ff800000;
            auVar285._12_4_ = 0xff800000;
            auVar285._16_4_ = 0xff800000;
            auVar285._20_4_ = 0xff800000;
            auVar285._24_4_ = 0xff800000;
            auVar285._28_4_ = 0xff800000;
            auVar286 = ZEXT3264(auVar285);
            auVar117 = vblendmps_avx512vl(auVar272,auVar285);
            bVar92 = (byte)uVar96;
            uVar103 = (uint)(bVar92 & 1) * auVar117._0_4_ |
                      (uint)!(bool)(bVar92 & 1) * auVar133._0_4_;
            bVar101 = (bool)((byte)(uVar96 >> 1) & 1);
            uVar170 = (uint)bVar101 * auVar117._4_4_ | (uint)!bVar101 * auVar133._4_4_;
            bVar101 = (bool)((byte)(uVar96 >> 2) & 1);
            uVar171 = (uint)bVar101 * auVar117._8_4_ | (uint)!bVar101 * auVar133._8_4_;
            bVar101 = (bool)((byte)(uVar96 >> 3) & 1);
            uVar172 = (uint)bVar101 * auVar117._12_4_ | (uint)!bVar101 * auVar133._12_4_;
            bVar101 = (bool)((byte)(uVar96 >> 4) & 1);
            uVar173 = (uint)bVar101 * auVar117._16_4_ | (uint)!bVar101 * auVar133._16_4_;
            bVar101 = (bool)((byte)(uVar96 >> 5) & 1);
            uVar174 = (uint)bVar101 * auVar117._20_4_ | (uint)!bVar101 * auVar133._20_4_;
            bVar101 = (bool)((byte)(uVar96 >> 6) & 1);
            uVar175 = (uint)bVar101 * auVar117._24_4_ | (uint)!bVar101 * auVar133._24_4_;
            bVar101 = SUB81(uVar96 >> 7,0);
            uVar176 = (uint)bVar101 * auVar117._28_4_ | (uint)!bVar101 * auVar133._28_4_;
            auVar165._0_4_ = (bVar97 & 1) * uVar103 | !(bool)(bVar97 & 1) * auVar165._0_4_;
            bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
            auVar165._4_4_ = bVar101 * uVar170 | !bVar101 * auVar165._4_4_;
            bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
            auVar165._8_4_ = bVar101 * uVar171 | !bVar101 * auVar165._8_4_;
            bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
            auVar165._12_4_ = bVar101 * uVar172 | !bVar101 * auVar165._12_4_;
            bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
            auVar165._16_4_ = bVar101 * uVar173 | !bVar101 * auVar165._16_4_;
            bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
            auVar165._20_4_ = bVar101 * uVar174 | !bVar101 * auVar165._20_4_;
            bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
            auVar165._24_4_ = bVar101 * uVar175 | !bVar101 * auVar165._24_4_;
            bVar101 = SUB81(uVar102 >> 7,0);
            auVar165._28_4_ = bVar101 * uVar176 | !bVar101 * auVar165._28_4_;
            auVar117 = vblendmps_avx512vl(auVar285,auVar272);
            bVar101 = (bool)((byte)(uVar96 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar96 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar96 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar96 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar96 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar96 >> 6) & 1);
            bVar10 = SUB81(uVar96 >> 7,0);
            auVar166._0_4_ =
                 (uint)(bVar97 & 1) *
                 ((uint)(bVar92 & 1) * auVar117._0_4_ | !(bool)(bVar92 & 1) * uVar103) |
                 !(bool)(bVar97 & 1) * auVar166._0_4_;
            bVar4 = (bool)((byte)(uVar102 >> 1) & 1);
            auVar166._4_4_ =
                 (uint)bVar4 * ((uint)bVar101 * auVar117._4_4_ | !bVar101 * uVar170) |
                 !bVar4 * auVar166._4_4_;
            bVar101 = (bool)((byte)(uVar102 >> 2) & 1);
            auVar166._8_4_ =
                 (uint)bVar101 * ((uint)bVar5 * auVar117._8_4_ | !bVar5 * uVar171) |
                 !bVar101 * auVar166._8_4_;
            bVar101 = (bool)((byte)(uVar102 >> 3) & 1);
            auVar166._12_4_ =
                 (uint)bVar101 * ((uint)bVar6 * auVar117._12_4_ | !bVar6 * uVar172) |
                 !bVar101 * auVar166._12_4_;
            bVar101 = (bool)((byte)(uVar102 >> 4) & 1);
            auVar166._16_4_ =
                 (uint)bVar101 * ((uint)bVar7 * auVar117._16_4_ | !bVar7 * uVar173) |
                 !bVar101 * auVar166._16_4_;
            bVar101 = (bool)((byte)(uVar102 >> 5) & 1);
            auVar166._20_4_ =
                 (uint)bVar101 * ((uint)bVar8 * auVar117._20_4_ | !bVar8 * uVar174) |
                 !bVar101 * auVar166._20_4_;
            bVar101 = (bool)((byte)(uVar102 >> 6) & 1);
            auVar166._24_4_ =
                 (uint)bVar101 * ((uint)bVar9 * auVar117._24_4_ | !bVar9 * uVar175) |
                 !bVar101 * auVar166._24_4_;
            bVar101 = SUB81(uVar102 >> 7,0);
            auVar166._28_4_ =
                 (uint)bVar101 * ((uint)bVar10 * auVar117._28_4_ | !bVar10 * uVar176) |
                 !bVar101 * auVar166._28_4_;
            bVar99 = (~bVar97 | bVar92) & bVar99;
          }
        }
        auVar117 = vmulps_avx512vl(local_840,auVar132);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_6c0,auVar131);
        auVar273 = ZEXT3264(local_6c0);
        auVar117 = vfmadd231ps_avx512vl(auVar117,local_820,auVar134);
        auVar282 = ZEXT3264(local_800);
        _local_540 = local_800;
        local_520 = vminps_avx(local_680,auVar165);
        auVar267._8_4_ = 0x7fffffff;
        auVar267._0_8_ = 0x7fffffff7fffffff;
        auVar267._12_4_ = 0x7fffffff;
        auVar267._16_4_ = 0x7fffffff;
        auVar267._20_4_ = 0x7fffffff;
        auVar267._24_4_ = 0x7fffffff;
        auVar267._28_4_ = 0x7fffffff;
        auVar117 = vandps_avx(auVar117,auVar267);
        _local_740 = vmaxps_avx(local_800,auVar166);
        auVar268._8_4_ = 0x3e99999a;
        auVar268._0_8_ = 0x3e99999a3e99999a;
        auVar268._12_4_ = 0x3e99999a;
        auVar268._16_4_ = 0x3e99999a;
        auVar268._20_4_ = 0x3e99999a;
        auVar268._24_4_ = 0x3e99999a;
        auVar268._28_4_ = 0x3e99999a;
        auVar269 = ZEXT3264(auVar268);
        uVar21 = vcmpps_avx512vl(auVar117,auVar268,1);
        uVar23 = vcmpps_avx512vl(local_800,local_520,2);
        bVar97 = (byte)uVar23 & bVar91;
        uVar22 = vcmpps_avx512vl(_local_740,local_680,2);
        if ((bVar91 & ((byte)uVar22 | (byte)uVar23)) == 0) {
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar291 = ZEXT3264(auVar117);
          auVar194 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          bVar92 = (byte)uVar21 | ~bVar99;
          auVar117 = vmulps_avx512vl(local_840,auVar280._0_32_);
          auVar106 = vfmadd213ps_fma(auVar138,local_6c0,auVar117);
          auVar117 = vfmadd213ps_avx512vl(auVar118,local_820,ZEXT1632(auVar106));
          auVar117 = vandps_avx(auVar117,auVar267);
          uVar21 = vcmpps_avx512vl(auVar117,auVar268,1);
          bVar99 = (byte)uVar21 | ~bVar99;
          auVar188._8_4_ = 2;
          auVar188._0_8_ = 0x200000002;
          auVar188._12_4_ = 2;
          auVar188._16_4_ = 2;
          auVar188._20_4_ = 2;
          auVar188._24_4_ = 2;
          auVar188._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar117 = vpblendmd_avx512vl(auVar188,auVar34);
          local_660._0_4_ = (uint)(bVar99 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar99 & 1) * 2;
          bVar101 = (bool)(bVar99 >> 1 & 1);
          local_660._4_4_ = (uint)bVar101 * auVar117._4_4_ | (uint)!bVar101 * 2;
          bVar101 = (bool)(bVar99 >> 2 & 1);
          local_660._8_4_ = (uint)bVar101 * auVar117._8_4_ | (uint)!bVar101 * 2;
          bVar101 = (bool)(bVar99 >> 3 & 1);
          local_660._12_4_ = (uint)bVar101 * auVar117._12_4_ | (uint)!bVar101 * 2;
          bVar101 = (bool)(bVar99 >> 4 & 1);
          local_660._16_4_ = (uint)bVar101 * auVar117._16_4_ | (uint)!bVar101 * 2;
          bVar101 = (bool)(bVar99 >> 5 & 1);
          local_660._20_4_ = (uint)bVar101 * auVar117._20_4_ | (uint)!bVar101 * 2;
          bVar101 = (bool)(bVar99 >> 6 & 1);
          local_660._24_4_ = (uint)bVar101 * auVar117._24_4_ | (uint)!bVar101 * 2;
          local_660._28_4_ = (uint)(bVar99 >> 7) * auVar117._28_4_ | (uint)!(bool)(bVar99 >> 7) * 2;
          local_6e0 = vpbroadcastd_avx512vl();
          uVar21 = vpcmpd_avx512vl(local_6e0,local_660,5);
          local_720 = local_800._0_4_ + (float)local_7e0._0_4_;
          fStack_71c = local_800._4_4_ + (float)local_7e0._4_4_;
          fStack_718 = local_800._8_4_ + fStack_7d8;
          fStack_714 = local_800._12_4_ + fStack_7d4;
          fStack_710 = local_800._16_4_ + fStack_7d0;
          fStack_70c = local_800._20_4_ + fStack_7cc;
          fStack_708 = local_800._24_4_ + fStack_7c8;
          fStack_704 = local_800._28_4_ + fStack_7c4;
          _local_6a0 = _local_740;
          for (bVar99 = (byte)uVar21 & bVar97; bVar99 != 0;
              bVar99 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar99 & (byte)uVar21) {
            auVar189._8_4_ = 0x7f800000;
            auVar189._0_8_ = 0x7f8000007f800000;
            auVar189._12_4_ = 0x7f800000;
            auVar189._16_4_ = 0x7f800000;
            auVar189._20_4_ = 0x7f800000;
            auVar189._24_4_ = 0x7f800000;
            auVar189._28_4_ = 0x7f800000;
            auVar117 = vblendmps_avx512vl(auVar189,local_800);
            auVar167._0_4_ =
                 (uint)(bVar99 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar99 & 1) * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 1 & 1);
            auVar167._4_4_ = (uint)bVar101 * auVar117._4_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 2 & 1);
            auVar167._8_4_ = (uint)bVar101 * auVar117._8_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 3 & 1);
            auVar167._12_4_ = (uint)bVar101 * auVar117._12_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 4 & 1);
            auVar167._16_4_ = (uint)bVar101 * auVar117._16_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 5 & 1);
            auVar167._20_4_ = (uint)bVar101 * auVar117._20_4_ | (uint)!bVar101 * 0x7f800000;
            auVar167._24_4_ =
                 (uint)(bVar99 >> 6) * auVar117._24_4_ | (uint)!(bool)(bVar99 >> 6) * 0x7f800000;
            auVar167._28_4_ = 0x7f800000;
            auVar117 = vshufps_avx(auVar167,auVar167,0xb1);
            auVar117 = vminps_avx(auVar167,auVar117);
            auVar118 = vshufpd_avx(auVar117,auVar117,5);
            auVar117 = vminps_avx(auVar117,auVar118);
            auVar118 = vpermpd_avx2(auVar117,0x4e);
            auVar117 = vminps_avx(auVar117,auVar118);
            uVar21 = vcmpps_avx512vl(auVar167,auVar117,0);
            bVar93 = (byte)uVar21 & bVar99;
            bVar94 = bVar99;
            if (bVar93 != 0) {
              bVar94 = bVar93;
            }
            iVar24 = 0;
            for (uVar103 = (uint)bVar94; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            uVar103 = *(uint *)(local_540 + (uint)(iVar24 << 2));
            fVar177 = auVar18._0_4_;
            auVar106 = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar24 << 2)));
            if ((float)local_9e0._0_4_ < 0.0) {
              local_a60._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar24 << 2)));
              auVar273 = ZEXT1664(auVar273._0_16_);
              auVar280 = ZEXT1664(auVar280._0_16_);
              auVar282 = ZEXT1664(auVar282._0_16_);
              auVar286 = ZEXT1664(auVar286._0_16_);
              fVar177 = sqrtf((float)local_9e0._0_4_);
              auVar106 = local_a60._0_16_;
            }
            auVar269 = ZEXT464(uVar103);
            auVar104 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar107 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar116 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar112 = vminps_avx(auVar104,auVar116);
            auVar104 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar116 = vmaxps_avx(auVar107,auVar104);
            auVar239._8_4_ = 0x7fffffff;
            auVar239._0_8_ = 0x7fffffff7fffffff;
            auVar239._12_4_ = 0x7fffffff;
            auVar107 = vandps_avx(auVar112,auVar239);
            auVar104 = vandps_avx(auVar116,auVar239);
            auVar107 = vmaxps_avx(auVar107,auVar104);
            auVar104 = vmovshdup_avx(auVar107);
            auVar104 = vmaxss_avx(auVar104,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar104);
            fVar274 = auVar107._0_4_ * 1.9073486e-06;
            local_a40._0_4_ = fVar177 * 1.9073486e-06;
            local_930 = vshufps_avx(auVar116,auVar116,0xff);
            auVar106 = vinsertps_avx(ZEXT416(uVar103),auVar106,0x10);
            auVar278 = ZEXT1664(auVar106);
            lVar100 = 5;
            do {
              do {
                bVar101 = lVar100 == 0;
                lVar100 = lVar100 + -1;
                if (bVar101) goto LAB_019e032a;
                uVar203 = auVar278._0_4_;
                auVar179._4_4_ = uVar203;
                auVar179._0_4_ = uVar203;
                auVar179._8_4_ = uVar203;
                auVar179._12_4_ = uVar203;
                auVar106 = vfmadd132ps_fma(auVar179,ZEXT816(0) << 0x40,local_9d0);
                auVar107 = vmovshdup_avx(auVar278._0_16_);
                fVar254 = auVar107._0_4_;
                fVar289 = 1.0 - fVar254;
                fVar276 = fVar289 * fVar289 * fVar289;
                fVar177 = fVar254 * fVar254;
                fVar255 = fVar254 * fVar177;
                auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar276),
                                           ZEXT416((uint)fVar255));
                fVar275 = fVar254 * fVar289;
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar275 * 6.0)),
                                           ZEXT416((uint)(fVar289 * fVar275)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar255),
                                           ZEXT416((uint)fVar276));
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * fVar275 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar254 * fVar275)));
                fVar276 = fVar276 * 0.16666667;
                fVar254 = (auVar104._0_4_ + auVar112._0_4_) * 0.16666667;
                fVar238 = (auVar116._0_4_ + auVar105._0_4_) * 0.16666667;
                fVar255 = fVar255 * 0.16666667;
                auVar221._0_4_ = fVar255 * (float)local_9c0._0_4_;
                auVar221._4_4_ = fVar255 * (float)local_9c0._4_4_;
                auVar221._8_4_ = fVar255 * fStack_9b8;
                auVar221._12_4_ = fVar255 * fStack_9b4;
                auVar256._4_4_ = fVar238;
                auVar256._0_4_ = fVar238;
                auVar256._8_4_ = fVar238;
                auVar256._12_4_ = fVar238;
                auVar104 = vfmadd132ps_fma(auVar256,auVar221,local_980._0_16_);
                auVar222._4_4_ = fVar254;
                auVar222._0_4_ = fVar254;
                auVar222._8_4_ = fVar254;
                auVar222._12_4_ = fVar254;
                auVar104 = vfmadd132ps_fma(auVar222,auVar104,local_9a0._0_16_);
                auVar204._4_4_ = fVar276;
                auVar204._0_4_ = fVar276;
                auVar204._8_4_ = fVar276;
                auVar204._12_4_ = fVar276;
                auVar104 = vfmadd132ps_fma(auVar204,auVar104,local_960._0_16_);
                local_860._0_16_ = auVar104;
                auVar104 = vsubps_avx(auVar106,auVar104);
                auVar106 = vdpps_avx(auVar104,auVar104,0x7f);
                local_a00._0_16_ = auVar106;
                local_a60._0_16_ = ZEXT416((uint)fVar289);
                local_7c0 = auVar278;
                if (auVar106._0_4_ < 0.0) {
                  local_a80._0_4_ = fVar177;
                  local_aa0._0_4_ = fVar275;
                  auVar273._0_4_ = sqrtf(auVar106._0_4_);
                  auVar273._4_60_ = extraout_var;
                  auVar106 = auVar273._0_16_;
                  fVar275 = (float)local_aa0._0_4_;
                  auVar116 = local_a60._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  local_a80._0_4_ = fVar177;
                  auVar116 = ZEXT416((uint)fVar289);
                }
                local_880._4_4_ = auVar116._0_4_;
                local_880._0_4_ = local_880._4_4_;
                fStack_878 = (float)local_880._4_4_;
                fStack_874 = (float)local_880._4_4_;
                auVar112 = vfnmsub213ss_fma(auVar107,auVar107,ZEXT416((uint)(fVar275 * 4.0)));
                auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar275 * 4.0)),auVar116,auVar116);
                fVar177 = (float)local_880._4_4_ * -(float)local_880._4_4_ * 0.5;
                fVar275 = auVar112._0_4_ * 0.5;
                fVar276 = auVar116._0_4_ * 0.5;
                local_a80._0_4_ = (float)local_a80._0_4_ * 0.5;
                auVar240._0_4_ = (float)local_a80._0_4_ * (float)local_9c0._0_4_;
                auVar240._4_4_ = (float)local_a80._0_4_ * (float)local_9c0._4_4_;
                auVar240._8_4_ = (float)local_a80._0_4_ * fStack_9b8;
                auVar240._12_4_ = (float)local_a80._0_4_ * fStack_9b4;
                auVar205._4_4_ = fVar276;
                auVar205._0_4_ = fVar276;
                auVar205._8_4_ = fVar276;
                auVar205._12_4_ = fVar276;
                auVar116 = vfmadd132ps_fma(auVar205,auVar240,local_980._0_16_);
                auVar223._4_4_ = fVar275;
                auVar223._0_4_ = fVar275;
                auVar223._8_4_ = fVar275;
                auVar223._12_4_ = fVar275;
                auVar116 = vfmadd132ps_fma(auVar223,auVar116,local_9a0._0_16_);
                auVar283._4_4_ = fVar177;
                auVar283._0_4_ = fVar177;
                auVar283._8_4_ = fVar177;
                auVar283._12_4_ = fVar177;
                _local_a80 = vfmadd132ps_fma(auVar283,auVar116,local_960._0_16_);
                local_8a0._0_16_ = vdpps_avx(_local_a80,_local_a80,0x7f);
                auVar56._12_4_ = 0;
                auVar56._0_12_ = ZEXT812(0);
                fVar177 = local_8a0._0_4_;
                local_a30 = vrsqrt14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar177));
                fVar275 = local_a30._0_4_;
                local_8c0._0_16_ = vrcp14ss_avx512f(auVar56 << 0x20,ZEXT416((uint)fVar177));
                auVar116 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
                local_8e0._0_4_ = auVar116._0_4_;
                local_aa0._0_4_ = auVar106._0_4_;
                if (fVar177 < -fVar177) {
                  fVar276 = sqrtf(fVar177);
                  auVar106 = ZEXT416((uint)local_aa0._0_4_);
                  auVar116 = _local_a80;
                }
                else {
                  auVar116 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                  fVar276 = auVar116._0_4_;
                  auVar116 = _local_a80;
                }
                fVar254 = local_a30._0_4_;
                fVar177 = fVar275 * 1.5 + fVar177 * -0.5 * fVar254 * fVar254 * fVar254;
                local_a30._0_4_ = auVar116._0_4_ * fVar177;
                local_a30._4_4_ = auVar116._4_4_ * fVar177;
                local_a30._8_4_ = auVar116._8_4_ * fVar177;
                local_a30._12_4_ = auVar116._12_4_ * fVar177;
                auVar112 = vdpps_avx(auVar104,local_a30,0x7f);
                fVar238 = auVar106._0_4_;
                fVar275 = auVar112._0_4_;
                auVar180._0_4_ = fVar275 * fVar275;
                auVar180._4_4_ = auVar112._4_4_ * auVar112._4_4_;
                auVar180._8_4_ = auVar112._8_4_ * auVar112._8_4_;
                auVar180._12_4_ = auVar112._12_4_ * auVar112._12_4_;
                auVar105 = vsubps_avx(local_a00._0_16_,auVar180);
                fVar254 = auVar105._0_4_;
                auVar206._4_12_ = ZEXT812(0) << 0x20;
                auVar206._0_4_ = fVar254;
                auVar108 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
                auVar109 = vmulss_avx512f(auVar108,ZEXT416(0x3fc00000));
                auVar110 = vmulss_avx512f(auVar105,ZEXT416(0xbf000000));
                if (fVar254 < 0.0) {
                  local_8f0._0_4_ = fVar276;
                  local_910._0_4_ = auVar109._0_4_;
                  local_920._4_4_ = fVar177;
                  local_920._0_4_ = fVar177;
                  fStack_918 = fVar177;
                  fStack_914 = fVar177;
                  local_900 = auVar108;
                  fVar254 = sqrtf(fVar254);
                  auVar110 = ZEXT416(auVar110._0_4_);
                  auVar109 = ZEXT416((uint)local_910._0_4_);
                  auVar106 = ZEXT416((uint)local_aa0._0_4_);
                  auVar108 = local_900;
                  auVar116 = _local_a80;
                  fVar177 = (float)local_920._0_4_;
                  fVar255 = (float)local_920._4_4_;
                  fVar289 = fStack_918;
                  fVar290 = fStack_914;
                  fVar276 = (float)local_8f0._0_4_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar105,auVar105);
                  fVar254 = auVar105._0_4_;
                  fVar255 = fVar177;
                  fVar289 = fVar177;
                  fVar290 = fVar177;
                }
                auVar286 = ZEXT1664(auVar116);
                auVar282 = ZEXT1664(local_a00._0_16_);
                auVar280 = ZEXT1664(auVar104);
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar107)
                ;
                auVar113 = vfmadd213ss_fma(auVar107,SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_)
                ;
                auVar115 = local_7c0._0_16_;
                auVar107 = vshufps_avx(auVar115,auVar115,0x55);
                auVar224._0_4_ = auVar107._0_4_ * (float)local_9c0._0_4_;
                auVar224._4_4_ = auVar107._4_4_ * (float)local_9c0._4_4_;
                auVar224._8_4_ = auVar107._8_4_ * fStack_9b8;
                auVar224._12_4_ = auVar107._12_4_ * fStack_9b4;
                auVar241._0_4_ = auVar113._0_4_;
                auVar241._4_4_ = auVar241._0_4_;
                auVar241._8_4_ = auVar241._0_4_;
                auVar241._12_4_ = auVar241._0_4_;
                auVar107 = vfmadd132ps_fma(auVar241,auVar224,local_980._0_16_);
                auVar207._0_4_ = auVar105._0_4_;
                auVar207._4_4_ = auVar207._0_4_;
                auVar207._8_4_ = auVar207._0_4_;
                auVar207._12_4_ = auVar207._0_4_;
                auVar107 = vfmadd132ps_fma(auVar207,auVar107,local_9a0._0_16_);
                auVar107 = vfmadd132ps_fma(_local_880,auVar107,local_960._0_16_);
                auVar208._0_4_ = auVar107._0_4_ * (float)local_8a0._0_4_;
                auVar208._4_4_ = auVar107._4_4_ * (float)local_8a0._0_4_;
                auVar208._8_4_ = auVar107._8_4_ * (float)local_8a0._0_4_;
                auVar208._12_4_ = auVar107._12_4_ * (float)local_8a0._0_4_;
                auVar107 = vdpps_avx(auVar116,auVar107,0x7f);
                fVar220 = auVar107._0_4_;
                auVar225._0_4_ = auVar116._0_4_ * fVar220;
                auVar225._4_4_ = auVar116._4_4_ * fVar220;
                auVar225._8_4_ = auVar116._8_4_ * fVar220;
                auVar225._12_4_ = auVar116._12_4_ * fVar220;
                auVar107 = vsubps_avx(auVar208,auVar225);
                fVar220 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
                auVar113 = vmaxss_avx(ZEXT416((uint)fVar274),
                                      ZEXT416((uint)(local_7c0._0_4_ * (float)local_a40._0_4_)));
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar111 = vxorps_avx512vl(auVar116,auVar26);
                auVar226._0_4_ = fVar177 * auVar107._0_4_ * fVar220;
                auVar226._4_4_ = fVar255 * auVar107._4_4_ * fVar220;
                auVar226._8_4_ = fVar289 * auVar107._8_4_ * fVar220;
                auVar226._12_4_ = fVar290 * auVar107._12_4_ * fVar220;
                auVar107 = vdpps_avx(auVar111,local_a30,0x7f);
                auVar105 = vfmadd213ss_fma(auVar106,ZEXT416((uint)fVar274),auVar113);
                auVar106 = vdpps_avx(auVar104,auVar226,0x7f);
                auVar114 = vfmadd213ss_fma(ZEXT416((uint)(fVar238 + 1.0)),
                                           ZEXT416((uint)(fVar274 / fVar276)),auVar105);
                fVar177 = auVar107._0_4_ + auVar106._0_4_;
                auVar106 = vdpps_avx(local_9d0,local_a30,0x7f);
                auVar107 = vdpps_avx(auVar104,auVar111,0x7f);
                auVar105 = vmulss_avx512f(auVar110,auVar108);
                auVar110 = vaddss_avx512f(auVar109,ZEXT416((uint)(auVar105._0_4_ *
                                                                 auVar108._0_4_ * auVar108._0_4_)));
                auVar105 = vdpps_avx(auVar104,local_9d0,0x7f);
                auVar109 = vfnmadd231ss_fma(auVar107,auVar112,ZEXT416((uint)fVar177));
                auVar105 = vfnmadd231ss_fma(auVar105,auVar112,auVar106);
                auVar107 = vpermilps_avx(local_860._0_16_,0xff);
                fVar254 = fVar254 - auVar107._0_4_;
                auVar108 = vshufps_avx(auVar116,auVar116,0xff);
                auVar107 = vfmsub213ss_fma(auVar109,auVar110,auVar108);
                auVar270._8_4_ = 0x80000000;
                auVar270._0_8_ = 0x8000000080000000;
                auVar270._12_4_ = 0x80000000;
                auVar273 = ZEXT1664(auVar270);
                auVar265._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                auVar265._8_4_ = auVar107._8_4_ ^ 0x80000000;
                auVar265._12_4_ = auVar107._12_4_ ^ 0x80000000;
                auVar269 = ZEXT1664(auVar265);
                auVar105 = ZEXT416((uint)(auVar105._0_4_ * auVar110._0_4_));
                auVar109 = vfmsub231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar107._0_4_)),
                                           ZEXT416((uint)fVar177),auVar105);
                auVar107 = vinsertps_avx(auVar265,auVar105,0x1c);
                auVar260._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar260._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar260._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar105 = vinsertps_avx(ZEXT416((uint)fVar177),auVar260,0x10);
                auVar242._0_4_ = auVar109._0_4_;
                auVar242._4_4_ = auVar242._0_4_;
                auVar242._8_4_ = auVar242._0_4_;
                auVar242._12_4_ = auVar242._0_4_;
                auVar106 = vdivps_avx(auVar107,auVar242);
                auVar107 = vdivps_avx(auVar105,auVar242);
                auVar243._0_4_ = fVar275 * auVar106._0_4_ + fVar254 * auVar107._0_4_;
                auVar243._4_4_ = fVar275 * auVar106._4_4_ + fVar254 * auVar107._4_4_;
                auVar243._8_4_ = fVar275 * auVar106._8_4_ + fVar254 * auVar107._8_4_;
                auVar243._12_4_ = fVar275 * auVar106._12_4_ + fVar254 * auVar107._12_4_;
                auVar106 = vsubps_avx(auVar115,auVar243);
                auVar278 = ZEXT1664(auVar106);
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx512vl(auVar112,auVar27);
              } while (auVar114._0_4_ <= auVar107._0_4_);
              auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar114._0_4_ + auVar113._0_4_)),local_930,
                                         ZEXT416(0x36000000));
              auVar28._8_4_ = 0x7fffffff;
              auVar28._0_8_ = 0x7fffffff7fffffff;
              auVar28._12_4_ = 0x7fffffff;
              auVar112 = vandps_avx512vl(ZEXT416((uint)fVar254),auVar28);
            } while (auVar107._0_4_ <= auVar112._0_4_);
            fVar177 = auVar106._0_4_ + (float)local_940._0_4_;
            if ((fVar195 <= fVar177) &&
               (fVar274 = pre->ray_space[9].vy.field_0.m128[(long)ray], fVar177 <= fVar274)) {
              auVar107 = vmovshdup_avx(auVar106);
              fVar275 = auVar107._0_4_;
              if ((0.0 <= fVar275) && (fVar275 <= 1.0)) {
                auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a00._0_4_));
                fVar276 = auVar107._0_4_;
                lVar100 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar197 * 8);
                if ((*(uint *)(lVar100 + 0x34) & (uint)pre->ray_space[10].vz.field_0.m128[(long)ray]
                    ) != 0) {
                  fVar276 = fVar276 * 1.5 + local_a00._0_4_ * -0.5 * fVar276 * fVar276 * fVar276;
                  auVar244._0_4_ = auVar104._0_4_ * fVar276;
                  auVar244._4_4_ = auVar104._4_4_ * fVar276;
                  auVar244._8_4_ = auVar104._8_4_ * fVar276;
                  auVar244._12_4_ = auVar104._12_4_ * fVar276;
                  auVar108 = vfmadd213ps_fma(auVar108,auVar244,auVar116);
                  auVar107 = vshufps_avx(auVar244,auVar244,0xc9);
                  auVar112 = vshufps_avx(auVar116,auVar116,0xc9);
                  auVar245._0_4_ = auVar244._0_4_ * auVar112._0_4_;
                  auVar245._4_4_ = auVar244._4_4_ * auVar112._4_4_;
                  auVar245._8_4_ = auVar244._8_4_ * auVar112._8_4_;
                  auVar245._12_4_ = auVar244._12_4_ * auVar112._12_4_;
                  auVar105 = vfmsub231ps_fma(auVar245,auVar116,auVar107);
                  auVar107 = vshufps_avx(auVar105,auVar105,0xc9);
                  auVar112 = vshufps_avx(auVar108,auVar108,0xc9);
                  auVar105 = vshufps_avx(auVar105,auVar105,0xd2);
                  auVar181._0_4_ = auVar108._0_4_ * auVar105._0_4_;
                  auVar181._4_4_ = auVar108._4_4_ * auVar105._4_4_;
                  auVar181._8_4_ = auVar108._8_4_ * auVar105._8_4_;
                  auVar181._12_4_ = auVar108._12_4_ * auVar105._12_4_;
                  auVar107 = vfmsub231ps_fma(auVar181,auVar107,auVar112);
                  if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) &&
                     (*(long *)(lVar100 + 0x40) == 0)) {
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar177;
                    fVar177 = (float)vextractps_avx(auVar107,1);
                    pre->ray_space[0xe].vz.field_0.m128[(long)ray] = fVar177;
                    uVar203 = vextractps_avx(auVar107,2);
                    *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x40) = uVar203;
                    pre[1].ray_space[0].vx.field_0.m128[(long)ray] = auVar107._0_4_;
                    pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar275;
                    pre[1].ray_space[2].vz.field_0.m128[(long)ray] = 0.0;
                    pre[1].ray_space[4].vx.field_0.m128[(long)ray] = fVar288;
                    pre[1].ray_space[5].vy.field_0.m128[(long)ray] = fVar197;
                    pre[1].ray_space[6].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                    pre[1].ray_space[8].vx.field_0.m128[(long)ray] =
                         *(float *)(*(long *)(k + 8) + 4);
                  }
                  else {
                    puVar2 = *(uint **)(k + 8);
                    auVar194 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar194,auVar278);
                    local_400 = vpermps_avx512f(auVar194,ZEXT1664(auVar107));
                    auVar194 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar194,ZEXT1664(auVar107));
                    local_380 = vbroadcastss_avx512f(auVar107);
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar194 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar194);
                    auVar117 = vpcmpeqd_avx2(auVar194._0_32_,auVar194._0_32_);
                    local_a20[3] = auVar117;
                    local_a20[2] = auVar117;
                    local_a20[1] = auVar117;
                    *local_a20 = auVar117;
                    local_240 = vbroadcastss_avx512f(ZEXT416(*puVar2));
                    local_200 = vbroadcastss_avx512f(ZEXT416(puVar2[1]));
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar177;
                    auVar194 = vmovdqa64_avx512f(local_4c0);
                    local_780 = vmovdqa64_avx512f(auVar194);
                    local_ad0 = local_780;
                    local_ac8 = *(undefined8 *)(lVar100 + 0x18);
                    local_ac0 = *(undefined8 *)(k + 8);
                    local_ab0 = (int *)local_400;
                    local_aa8 = 0x10;
                    local_ab8 = pre;
                    if (*(code **)(lVar100 + 0x40) != (code *)0x0) {
                      auVar269 = ZEXT1664(auVar265);
                      auVar273 = ZEXT1664(auVar270);
                      auVar278 = ZEXT1664(auVar106);
                      auVar280 = ZEXT1664(auVar104);
                      auVar282 = ZEXT1664(local_a00._0_16_);
                      auVar286 = ZEXT1664(auVar116);
                      (**(code **)(lVar100 + 0x40))(&local_ad0);
                      auVar194 = vmovdqa64_avx512f(local_780);
                    }
                    uVar21 = vptestmd_avx512f(auVar194,auVar194);
                    if ((short)uVar21 != 0) {
                      pcVar3 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                      if ((pcVar3 != (code *)0x0) &&
                         (((**(byte **)(k + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar100 + 0x3e) & 0x40) != 0)))) {
                        auVar269 = ZEXT1664(auVar269._0_16_);
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        auVar278 = ZEXT1664(auVar278._0_16_);
                        auVar280 = ZEXT1664(auVar280._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        (*pcVar3)(&local_ad0);
                        auVar194 = vmovdqa64_avx512f(local_780);
                      }
                      uVar102 = vptestmd_avx512f(auVar194,auVar194);
                      if ((short)uVar102 != 0) {
                        iVar58 = local_ab0[1];
                        iVar59 = local_ab0[2];
                        iVar60 = local_ab0[3];
                        iVar61 = local_ab0[4];
                        iVar62 = local_ab0[5];
                        iVar63 = local_ab0[6];
                        iVar64 = local_ab0[7];
                        iVar65 = local_ab0[8];
                        iVar66 = local_ab0[9];
                        iVar67 = local_ab0[10];
                        iVar68 = local_ab0[0xb];
                        iVar69 = local_ab0[0xc];
                        iVar70 = local_ab0[0xd];
                        iVar71 = local_ab0[0xe];
                        iVar72 = local_ab0[0xf];
                        pVVar1 = &local_ab8->ray_space[0xe].vz;
                        iVar73 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8->ray_space[0xf].vx.field_0;
                        iVar77 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8->ray_space[0xf].vy.field_0;
                        iVar81 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8->ray_space[0xf].vz.field_0;
                        iVar85 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 0xc);
                        bVar94 = (byte)uVar102;
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar93 = (byte)(uVar102 >> 8);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar94 & 1) * *local_ab0 |
                                    (uint)!(bool)(bVar94 & 1) * *(int *)&pVVar1->field_0);
                        local_ab8->ray_space[0xe].vz.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8->ray_space[0xe].vz.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8->ray_space[0xe].vz.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8->ray_space[0xf].vx.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8->ray_space[0xf].vx.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8->ray_space[0xf].vx.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8->ray_space[0xf].vx.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8->ray_space[0xf].vy.field_0.m128[0] =
                             (float)((uint)(bVar93 & 1) * iVar65 |
                                    (uint)!(bool)(bVar93 & 1) * iVar80);
                        local_ab8->ray_space[0xf].vy.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8->ray_space[0xf].vy.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8->ray_space[0xf].vy.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8->ray_space[0xf].vz.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8->ray_space[0xf].vz.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8->ray_space[0xf].vz.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8->ray_space[0xf].vz.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        iVar58 = local_ab0[0x11];
                        iVar59 = local_ab0[0x12];
                        iVar60 = local_ab0[0x13];
                        iVar61 = local_ab0[0x14];
                        iVar62 = local_ab0[0x15];
                        iVar63 = local_ab0[0x16];
                        iVar64 = local_ab0[0x17];
                        iVar65 = local_ab0[0x18];
                        iVar66 = local_ab0[0x19];
                        iVar67 = local_ab0[0x1a];
                        iVar68 = local_ab0[0x1b];
                        iVar69 = local_ab0[0x1c];
                        iVar70 = local_ab0[0x1d];
                        iVar71 = local_ab0[0x1e];
                        iVar72 = local_ab0[0x1f];
                        iVar73 = local_ab8[1].depth_scale.field_0.i[1];
                        iVar74 = local_ab8[1].depth_scale.field_0.i[2];
                        iVar75 = local_ab8[1].depth_scale.field_0.i[3];
                        iVar76 = local_ab8[1].depth_scale.field_0.i[4];
                        iVar77 = local_ab8[1].depth_scale.field_0.i[5];
                        iVar78 = local_ab8[1].depth_scale.field_0.i[6];
                        iVar79 = local_ab8[1].depth_scale.field_0.i[7];
                        iVar80 = local_ab8[1].depth_scale.field_0.i[8];
                        iVar81 = local_ab8[1].depth_scale.field_0.i[9];
                        iVar82 = local_ab8[1].depth_scale.field_0.i[10];
                        iVar83 = local_ab8[1].depth_scale.field_0.i[0xb];
                        iVar84 = local_ab8[1].depth_scale.field_0.i[0xc];
                        iVar85 = local_ab8[1].depth_scale.field_0.i[0xd];
                        iVar86 = local_ab8[1].depth_scale.field_0.i[0xe];
                        iVar87 = local_ab8[1].depth_scale.field_0.i[0xf];
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        local_ab8[1].depth_scale.field_0.i[0] =
                             (uint)(bVar94 & 1) * local_ab0[0x10] |
                             (uint)!(bool)(bVar94 & 1) * local_ab8[1].depth_scale.field_0.i[0];
                        local_ab8[1].depth_scale.field_0.i[1] =
                             (uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73;
                        local_ab8[1].depth_scale.field_0.i[2] =
                             (uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74;
                        local_ab8[1].depth_scale.field_0.i[3] =
                             (uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75;
                        local_ab8[1].depth_scale.field_0.i[4] =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76;
                        local_ab8[1].depth_scale.field_0.i[5] =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77;
                        local_ab8[1].depth_scale.field_0.i[6] =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78;
                        local_ab8[1].depth_scale.field_0.i[7] =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79;
                        local_ab8[1].depth_scale.field_0.i[8] =
                             (uint)(bVar93 & 1) * iVar65 | (uint)!(bool)(bVar93 & 1) * iVar80;
                        local_ab8[1].depth_scale.field_0.i[9] =
                             (uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81;
                        local_ab8[1].depth_scale.field_0.i[10] =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82;
                        local_ab8[1].depth_scale.field_0.i[0xb] =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83;
                        local_ab8[1].depth_scale.field_0.i[0xc] =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84;
                        local_ab8[1].depth_scale.field_0.i[0xd] =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85;
                        local_ab8[1].depth_scale.field_0.i[0xe] =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86;
                        local_ab8[1].depth_scale.field_0.i[0xf] =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87;
                        iVar58 = local_ab0[0x21];
                        iVar59 = local_ab0[0x22];
                        iVar60 = local_ab0[0x23];
                        iVar61 = local_ab0[0x24];
                        iVar62 = local_ab0[0x25];
                        iVar63 = local_ab0[0x26];
                        iVar64 = local_ab0[0x27];
                        iVar65 = local_ab0[0x28];
                        iVar66 = local_ab0[0x29];
                        iVar67 = local_ab0[0x2a];
                        iVar68 = local_ab0[0x2b];
                        iVar69 = local_ab0[0x2c];
                        iVar70 = local_ab0[0x2d];
                        iVar71 = local_ab0[0x2e];
                        iVar72 = local_ab0[0x2f];
                        iVar73 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8[1].ray_space[0].vy.field_0;
                        iVar77 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8[1].ray_space[0].vz.field_0;
                        iVar81 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8[1].ray_space[1].vx.field_0;
                        iVar85 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 0xc);
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        local_ab8[1].ray_space[0].vx.field_0.m128[0] =
                             (float)((uint)(bVar94 & 1) * local_ab0[0x20] |
                                    (uint)!(bool)(bVar94 & 1) *
                                    *(int *)&local_ab8[1].ray_space[0].vx.field_0);
                        local_ab8[1].ray_space[0].vx.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8[1].ray_space[0].vx.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8[1].ray_space[0].vx.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8[1].ray_space[0].vy.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8[1].ray_space[0].vy.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8[1].ray_space[0].vy.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8[1].ray_space[0].vy.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8[1].ray_space[0].vz.field_0.m128[0] =
                             (float)((uint)(bVar93 & 1) * iVar65 |
                                    (uint)!(bool)(bVar93 & 1) * iVar80);
                        local_ab8[1].ray_space[0].vz.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8[1].ray_space[0].vz.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8[1].ray_space[0].vz.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8[1].ray_space[1].vx.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8[1].ray_space[1].vx.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8[1].ray_space[1].vx.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8[1].ray_space[1].vx.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        iVar58 = local_ab0[0x31];
                        iVar59 = local_ab0[0x32];
                        iVar60 = local_ab0[0x33];
                        iVar61 = local_ab0[0x34];
                        iVar62 = local_ab0[0x35];
                        iVar63 = local_ab0[0x36];
                        iVar64 = local_ab0[0x37];
                        iVar65 = local_ab0[0x38];
                        iVar66 = local_ab0[0x39];
                        iVar67 = local_ab0[0x3a];
                        iVar68 = local_ab0[0x3b];
                        iVar69 = local_ab0[0x3c];
                        iVar70 = local_ab0[0x3d];
                        iVar71 = local_ab0[0x3e];
                        iVar72 = local_ab0[0x3f];
                        pVVar1 = &local_ab8[1].ray_space[1].vy;
                        iVar73 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8[1].ray_space[1].vz.field_0;
                        iVar77 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8[1].ray_space[2].vx.field_0;
                        iVar81 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8[1].ray_space[2].vy.field_0;
                        iVar85 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 0xc);
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar94 & 1) * local_ab0[0x30] |
                                    (uint)!(bool)(bVar94 & 1) * *(int *)&pVVar1->field_0);
                        local_ab8[1].ray_space[1].vy.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8[1].ray_space[1].vy.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8[1].ray_space[1].vy.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8[1].ray_space[1].vz.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8[1].ray_space[1].vz.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8[1].ray_space[1].vz.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8[1].ray_space[1].vz.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8[1].ray_space[2].vx.field_0.m128[0] =
                             (float)((uint)(bVar93 & 1) * iVar65 |
                                    (uint)!(bool)(bVar93 & 1) * iVar80);
                        local_ab8[1].ray_space[2].vx.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8[1].ray_space[2].vx.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8[1].ray_space[2].vx.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8[1].ray_space[2].vy.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8[1].ray_space[2].vy.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8[1].ray_space[2].vy.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8[1].ray_space[2].vy.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        iVar58 = local_ab0[0x41];
                        iVar59 = local_ab0[0x42];
                        iVar60 = local_ab0[0x43];
                        iVar61 = local_ab0[0x44];
                        iVar62 = local_ab0[0x45];
                        iVar63 = local_ab0[0x46];
                        iVar64 = local_ab0[0x47];
                        iVar65 = local_ab0[0x48];
                        iVar66 = local_ab0[0x49];
                        iVar67 = local_ab0[0x4a];
                        iVar68 = local_ab0[0x4b];
                        iVar69 = local_ab0[0x4c];
                        iVar70 = local_ab0[0x4d];
                        iVar71 = local_ab0[0x4e];
                        iVar72 = local_ab0[0x4f];
                        pVVar1 = &local_ab8[1].ray_space[2].vz;
                        iVar73 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8[1].ray_space[3].vx.field_0;
                        iVar77 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8[1].ray_space[3].vy.field_0;
                        iVar81 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8[1].ray_space[3].vz.field_0;
                        iVar85 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 0xc);
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar94 & 1) * local_ab0[0x40] |
                                    (uint)!(bool)(bVar94 & 1) * *(int *)&pVVar1->field_0);
                        local_ab8[1].ray_space[2].vz.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8[1].ray_space[2].vz.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8[1].ray_space[2].vz.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8[1].ray_space[3].vx.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8[1].ray_space[3].vx.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8[1].ray_space[3].vx.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8[1].ray_space[3].vx.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8[1].ray_space[3].vy.field_0.m128[0] =
                             (float)((uint)(bVar93 & 1) * iVar65 |
                                    (uint)!(bool)(bVar93 & 1) * iVar80);
                        local_ab8[1].ray_space[3].vy.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8[1].ray_space[3].vy.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8[1].ray_space[3].vy.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8[1].ray_space[3].vz.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8[1].ray_space[3].vz.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8[1].ray_space[3].vz.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8[1].ray_space[3].vz.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x50));
                        auVar194 = vmovdqu32_avx512f(auVar194);
                        *(undefined1 (*) [64])(local_ab8[1].ray_space + 4) = auVar194;
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x60));
                        auVar194 = vmovdqu32_avx512f(auVar194);
                        *(undefined1 (*) [64])&local_ab8[1].ray_space[5].vy = auVar194;
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x70));
                        auVar194 = vmovdqa32_avx512f(auVar194);
                        *(undefined1 (*) [64])&local_ab8[1].ray_space[6].vz = auVar194;
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x80));
                        auVar194 = vmovdqa32_avx512f(auVar194);
                        *(undefined1 (*) [64])(local_ab8[1].ray_space + 8) = auVar194;
                        goto LAB_019e032a;
                      }
                    }
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar274;
                  }
                }
              }
            }
LAB_019e032a:
            uVar203 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
            auVar262._4_4_ = uVar203;
            auVar262._0_4_ = uVar203;
            auVar262._8_4_ = uVar203;
            auVar262._12_4_ = uVar203;
            auVar262._16_4_ = uVar203;
            auVar262._20_4_ = uVar203;
            auVar262._24_4_ = uVar203;
            auVar262._28_4_ = uVar203;
            auVar194 = ZEXT3264(auVar262);
            auVar88._4_4_ = fStack_71c;
            auVar88._0_4_ = local_720;
            auVar88._8_4_ = fStack_718;
            auVar88._12_4_ = fStack_714;
            auVar88._16_4_ = fStack_710;
            auVar88._20_4_ = fStack_70c;
            auVar88._24_4_ = fStack_708;
            auVar88._28_4_ = fStack_704;
            uVar21 = vcmpps_avx512vl(auVar262,auVar88,0xd);
          }
          auVar190._0_4_ = (float)local_7e0._0_4_ + (float)local_740._0_4_;
          auVar190._4_4_ = (float)local_7e0._4_4_ + (float)local_740._4_4_;
          auVar190._8_4_ = fStack_7d8 + fStack_738;
          auVar190._12_4_ = fStack_7d4 + fStack_734;
          auVar190._16_4_ = fStack_7d0 + fStack_730;
          auVar190._20_4_ = fStack_7cc + fStack_72c;
          auVar190._24_4_ = fStack_7c8 + fStack_728;
          auVar190._28_4_ = fStack_7c4 + fStack_724;
          uVar203 = auVar194._0_4_;
          auVar215._4_4_ = uVar203;
          auVar215._0_4_ = uVar203;
          auVar215._8_4_ = uVar203;
          auVar215._12_4_ = uVar203;
          auVar215._16_4_ = uVar203;
          auVar215._20_4_ = uVar203;
          auVar215._24_4_ = uVar203;
          auVar215._28_4_ = uVar203;
          uVar21 = vcmpps_avx512vl(auVar190,auVar215,2);
          auVar191._8_4_ = 2;
          auVar191._0_8_ = 0x200000002;
          auVar191._12_4_ = 2;
          auVar191._16_4_ = 2;
          auVar191._20_4_ = 2;
          auVar191._24_4_ = 2;
          auVar191._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar117 = vpblendmd_avx512vl(auVar191,auVar35);
          local_740._0_4_ = (uint)(bVar92 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar92 & 1) * 2;
          bVar101 = (bool)(bVar92 >> 1 & 1);
          local_740._4_4_ = (uint)bVar101 * auVar117._4_4_ | (uint)!bVar101 * 2;
          bVar101 = (bool)(bVar92 >> 2 & 1);
          fStack_738 = (float)((uint)bVar101 * auVar117._8_4_ | (uint)!bVar101 * 2);
          bVar101 = (bool)(bVar92 >> 3 & 1);
          fStack_734 = (float)((uint)bVar101 * auVar117._12_4_ | (uint)!bVar101 * 2);
          bVar101 = (bool)(bVar92 >> 4 & 1);
          fStack_730 = (float)((uint)bVar101 * auVar117._16_4_ | (uint)!bVar101 * 2);
          bVar101 = (bool)(bVar92 >> 5 & 1);
          fStack_72c = (float)((uint)bVar101 * auVar117._20_4_ | (uint)!bVar101 * 2);
          bVar101 = (bool)(bVar92 >> 6 & 1);
          fStack_728 = (float)((uint)bVar101 * auVar117._24_4_ | (uint)!bVar101 * 2);
          fStack_724 = (float)((uint)(bVar92 >> 7) * auVar117._28_4_ |
                              (uint)!(bool)(bVar92 >> 7) * 2);
          bVar91 = (byte)uVar22 & bVar91 & (byte)uVar21;
          uVar21 = vpcmpd_avx512vl(_local_740,local_6e0,2);
          local_800 = _local_6a0;
          local_720 = (float)local_7e0._0_4_ + (float)local_6a0._0_4_;
          fStack_71c = (float)local_7e0._4_4_ + (float)local_6a0._4_4_;
          fStack_718 = fStack_7d8 + fStack_698;
          fStack_714 = fStack_7d4 + fStack_694;
          fStack_710 = fStack_7d0 + fStack_690;
          fStack_70c = fStack_7cc + fStack_68c;
          fStack_708 = fStack_7c8 + fStack_688;
          fStack_704 = fStack_7c4 + fStack_684;
          for (bVar99 = (byte)uVar21 & bVar91; bVar99 != 0;
              bVar99 = ~('\x01' << ((byte)iVar24 & 0x1f)) & bVar99 & (byte)uVar21) {
            auVar192._8_4_ = 0x7f800000;
            auVar192._0_8_ = 0x7f8000007f800000;
            auVar192._12_4_ = 0x7f800000;
            auVar192._16_4_ = 0x7f800000;
            auVar192._20_4_ = 0x7f800000;
            auVar192._24_4_ = 0x7f800000;
            auVar192._28_4_ = 0x7f800000;
            auVar117 = vblendmps_avx512vl(auVar192,local_800);
            auVar168._0_4_ =
                 (uint)(bVar99 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar99 & 1) * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 1 & 1);
            auVar168._4_4_ = (uint)bVar101 * auVar117._4_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 2 & 1);
            auVar168._8_4_ = (uint)bVar101 * auVar117._8_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 3 & 1);
            auVar168._12_4_ = (uint)bVar101 * auVar117._12_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 4 & 1);
            auVar168._16_4_ = (uint)bVar101 * auVar117._16_4_ | (uint)!bVar101 * 0x7f800000;
            bVar101 = (bool)(bVar99 >> 5 & 1);
            auVar168._20_4_ = (uint)bVar101 * auVar117._20_4_ | (uint)!bVar101 * 0x7f800000;
            auVar168._24_4_ =
                 (uint)(bVar99 >> 6) * auVar117._24_4_ | (uint)!(bool)(bVar99 >> 6) * 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar117 = vshufps_avx(auVar168,auVar168,0xb1);
            auVar117 = vminps_avx(auVar168,auVar117);
            auVar118 = vshufpd_avx(auVar117,auVar117,5);
            auVar117 = vminps_avx(auVar117,auVar118);
            auVar118 = vpermpd_avx2(auVar117,0x4e);
            auVar117 = vminps_avx(auVar117,auVar118);
            uVar21 = vcmpps_avx512vl(auVar168,auVar117,0);
            bVar94 = (byte)uVar21 & bVar99;
            bVar92 = bVar99;
            if (bVar94 != 0) {
              bVar92 = bVar94;
            }
            iVar24 = 0;
            for (uVar103 = (uint)bVar92; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x80000000) {
              iVar24 = iVar24 + 1;
            }
            uVar103 = *(uint *)(local_680 + (uint)(iVar24 << 2));
            fVar177 = auVar17._0_4_;
            auVar106 = ZEXT416(*(uint *)(local_500 + (uint)(iVar24 << 2)));
            if ((float)local_9e0._0_4_ < 0.0) {
              local_a60._0_16_ = ZEXT416(*(uint *)(local_500 + (uint)(iVar24 << 2)));
              auVar273 = ZEXT1664(auVar273._0_16_);
              auVar280 = ZEXT1664(auVar280._0_16_);
              auVar282 = ZEXT1664(auVar282._0_16_);
              auVar286 = ZEXT1664(auVar286._0_16_);
              fVar177 = sqrtf((float)local_9e0._0_4_);
              auVar106 = local_a60._0_16_;
            }
            auVar269 = ZEXT464(uVar103);
            auVar104 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar107 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar116 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar112 = vminps_avx(auVar104,auVar116);
            auVar104 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar116 = vmaxps_avx(auVar107,auVar104);
            auVar246._8_4_ = 0x7fffffff;
            auVar246._0_8_ = 0x7fffffff7fffffff;
            auVar246._12_4_ = 0x7fffffff;
            auVar107 = vandps_avx(auVar112,auVar246);
            auVar104 = vandps_avx(auVar116,auVar246);
            auVar107 = vmaxps_avx(auVar107,auVar104);
            auVar104 = vmovshdup_avx(auVar107);
            auVar104 = vmaxss_avx(auVar104,auVar107);
            auVar107 = vshufpd_avx(auVar107,auVar107,1);
            auVar107 = vmaxss_avx(auVar107,auVar104);
            local_a30._0_4_ = auVar107._0_4_ * 1.9073486e-06;
            local_930 = vshufps_avx(auVar116,auVar116,0xff);
            auVar106 = vinsertps_avx(ZEXT416(uVar103),auVar106,0x10);
            auVar278 = ZEXT1664(auVar106);
            lVar100 = 5;
            do {
              do {
                bVar101 = lVar100 == 0;
                lVar100 = lVar100 + -1;
                if (bVar101) goto LAB_019e104d;
                uVar203 = auVar278._0_4_;
                auVar182._4_4_ = uVar203;
                auVar182._0_4_ = uVar203;
                auVar182._8_4_ = uVar203;
                auVar182._12_4_ = uVar203;
                auVar106 = vfmadd132ps_fma(auVar182,ZEXT816(0) << 0x40,local_9d0);
                auVar107 = vmovshdup_avx(auVar278._0_16_);
                fVar254 = auVar107._0_4_;
                fVar289 = 1.0 - fVar254;
                fVar276 = fVar289 * fVar289 * fVar289;
                fVar274 = fVar254 * fVar254;
                fVar255 = fVar254 * fVar274;
                auVar104 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar276),
                                           ZEXT416((uint)fVar255));
                fVar275 = fVar254 * fVar289;
                auVar112 = vfmadd231ss_fma(ZEXT416((uint)(fVar254 * fVar275 * 6.0)),
                                           ZEXT416((uint)(fVar289 * fVar275)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar255),
                                           ZEXT416((uint)fVar276));
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar289 * fVar275 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar254 * fVar275)));
                fVar276 = fVar276 * 0.16666667;
                fVar254 = (auVar104._0_4_ + auVar112._0_4_) * 0.16666667;
                fVar238 = (auVar116._0_4_ + auVar105._0_4_) * 0.16666667;
                fVar255 = fVar255 * 0.16666667;
                auVar227._0_4_ = fVar255 * (float)local_9c0._0_4_;
                auVar227._4_4_ = fVar255 * (float)local_9c0._4_4_;
                auVar227._8_4_ = fVar255 * fStack_9b8;
                auVar227._12_4_ = fVar255 * fStack_9b4;
                auVar257._4_4_ = fVar238;
                auVar257._0_4_ = fVar238;
                auVar257._8_4_ = fVar238;
                auVar257._12_4_ = fVar238;
                auVar104 = vfmadd132ps_fma(auVar257,auVar227,local_980._0_16_);
                auVar228._4_4_ = fVar254;
                auVar228._0_4_ = fVar254;
                auVar228._8_4_ = fVar254;
                auVar228._12_4_ = fVar254;
                auVar104 = vfmadd132ps_fma(auVar228,auVar104,local_9a0._0_16_);
                auVar209._4_4_ = fVar276;
                auVar209._0_4_ = fVar276;
                auVar209._8_4_ = fVar276;
                auVar209._12_4_ = fVar276;
                auVar104 = vfmadd132ps_fma(auVar209,auVar104,local_960._0_16_);
                local_860._0_16_ = auVar104;
                auVar104 = vsubps_avx(auVar106,auVar104);
                auVar106 = vdpps_avx(auVar104,auVar104,0x7f);
                local_a00._0_16_ = auVar106;
                local_a60._0_16_ = ZEXT416((uint)fVar289);
                local_7c0 = auVar278;
                if (auVar106._0_4_ < 0.0) {
                  local_a80._0_4_ = fVar274;
                  local_aa0._0_4_ = fVar275;
                  auVar269._0_4_ = sqrtf(auVar106._0_4_);
                  auVar269._4_60_ = extraout_var_00;
                  auVar106 = auVar269._0_16_;
                  fVar275 = (float)local_aa0._0_4_;
                  auVar116 = local_a60._0_16_;
                }
                else {
                  auVar106 = vsqrtss_avx(auVar106,auVar106);
                  local_a80._0_4_ = fVar274;
                  auVar116 = ZEXT416((uint)fVar289);
                }
                local_880._4_4_ = auVar116._0_4_;
                local_880._0_4_ = local_880._4_4_;
                fStack_878 = (float)local_880._4_4_;
                fStack_874 = (float)local_880._4_4_;
                auVar112 = vfnmsub213ss_fma(auVar107,auVar107,ZEXT416((uint)(fVar275 * 4.0)));
                auVar116 = vfmadd231ss_fma(ZEXT416((uint)(fVar275 * 4.0)),auVar116,auVar116);
                fVar274 = (float)local_880._4_4_ * -(float)local_880._4_4_ * 0.5;
                fVar275 = auVar112._0_4_ * 0.5;
                fVar276 = auVar116._0_4_ * 0.5;
                local_a80._0_4_ = (float)local_a80._0_4_ * 0.5;
                auVar247._0_4_ = (float)local_a80._0_4_ * (float)local_9c0._0_4_;
                auVar247._4_4_ = (float)local_a80._0_4_ * (float)local_9c0._4_4_;
                auVar247._8_4_ = (float)local_a80._0_4_ * fStack_9b8;
                auVar247._12_4_ = (float)local_a80._0_4_ * fStack_9b4;
                auVar210._4_4_ = fVar276;
                auVar210._0_4_ = fVar276;
                auVar210._8_4_ = fVar276;
                auVar210._12_4_ = fVar276;
                auVar116 = vfmadd132ps_fma(auVar210,auVar247,local_980._0_16_);
                auVar229._4_4_ = fVar275;
                auVar229._0_4_ = fVar275;
                auVar229._8_4_ = fVar275;
                auVar229._12_4_ = fVar275;
                auVar116 = vfmadd132ps_fma(auVar229,auVar116,local_9a0._0_16_);
                auVar284._4_4_ = fVar274;
                auVar284._0_4_ = fVar274;
                auVar284._8_4_ = fVar274;
                auVar284._12_4_ = fVar274;
                _local_a80 = vfmadd132ps_fma(auVar284,auVar116,local_960._0_16_);
                local_8a0._0_16_ = vdpps_avx(_local_a80,_local_a80,0x7f);
                auVar57._12_4_ = 0;
                auVar57._0_12_ = ZEXT812(0);
                fVar274 = local_8a0._0_4_;
                auVar112 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar274));
                local_8c0._0_16_ = vrcp14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)fVar274));
                auVar116 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
                local_8e0._0_4_ = auVar116._0_4_;
                local_aa0._0_4_ = auVar106._0_4_;
                if (fVar274 < -fVar274) {
                  local_a40 = auVar112;
                  fVar275 = sqrtf(fVar274);
                  auVar106 = ZEXT416((uint)local_aa0._0_4_);
                  auVar116 = local_a40;
                  auVar105 = _local_a80;
                }
                else {
                  auVar116 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                  fVar275 = auVar116._0_4_;
                  auVar116 = auVar112;
                  auVar105 = _local_a80;
                }
                fVar276 = auVar116._0_4_;
                auVar110 = vbroadcastss_avx512vl
                                     (ZEXT416((uint)(auVar112._0_4_ * 1.5 +
                                                    fVar274 * -0.5 * fVar276 * fVar276 * fVar276)));
                auVar109 = vmulps_avx512vl(auVar105,auVar110);
                auVar116 = vdpps_avx(auVar104,auVar109,0x7f);
                fVar274 = auVar106._0_4_ + 1.0;
                fVar276 = auVar116._0_4_;
                auVar183._0_4_ = fVar276 * fVar276;
                auVar183._4_4_ = auVar116._4_4_ * auVar116._4_4_;
                auVar183._8_4_ = auVar116._8_4_ * auVar116._8_4_;
                auVar183._12_4_ = auVar116._12_4_ * auVar116._12_4_;
                auVar112 = vsubps_avx(local_a00._0_16_,auVar183);
                fVar254 = auVar112._0_4_;
                auVar211._4_12_ = ZEXT812(0) << 0x20;
                auVar211._0_4_ = fVar254;
                auVar108 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
                auVar113 = vmulss_avx512f(auVar108,ZEXT416(0x3fc00000));
                auVar114 = vmulss_avx512f(auVar112,ZEXT416(0xbf000000));
                if (fVar254 < 0.0) {
                  local_a40._0_4_ = fVar274;
                  local_900._0_4_ = auVar113._0_4_;
                  _local_920 = auVar110;
                  local_910 = auVar109;
                  local_8f0 = auVar108;
                  fVar254 = sqrtf(fVar254);
                  auVar114 = ZEXT416(auVar114._0_4_);
                  auVar113 = ZEXT416((uint)local_900._0_4_);
                  auVar106 = ZEXT416((uint)local_aa0._0_4_);
                  auVar108 = local_8f0;
                  auVar105 = _local_a80;
                  fVar274 = (float)local_a40._0_4_;
                  auVar109 = local_910;
                  auVar110 = _local_920;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar112,auVar112);
                  fVar254 = auVar112._0_4_;
                }
                auVar286 = ZEXT1664(auVar105);
                auVar282 = ZEXT1664(local_a00._0_16_);
                auVar280 = ZEXT1664(auVar104);
                auVar112 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar107)
                ;
                auVar111 = vfmadd213ss_fma(auVar107,SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_)
                ;
                auVar277 = local_7c0._0_16_;
                auVar107 = vshufps_avx(auVar277,auVar277,0x55);
                auVar230._0_4_ = auVar107._0_4_ * (float)local_9c0._0_4_;
                auVar230._4_4_ = auVar107._4_4_ * (float)local_9c0._4_4_;
                auVar230._8_4_ = auVar107._8_4_ * fStack_9b8;
                auVar230._12_4_ = auVar107._12_4_ * fStack_9b4;
                auVar248._0_4_ = auVar111._0_4_;
                auVar248._4_4_ = auVar248._0_4_;
                auVar248._8_4_ = auVar248._0_4_;
                auVar248._12_4_ = auVar248._0_4_;
                auVar107 = vfmadd132ps_fma(auVar248,auVar230,local_980._0_16_);
                auVar212._0_4_ = auVar112._0_4_;
                auVar212._4_4_ = auVar212._0_4_;
                auVar212._8_4_ = auVar212._0_4_;
                auVar212._12_4_ = auVar212._0_4_;
                auVar107 = vfmadd132ps_fma(auVar212,auVar107,local_9a0._0_16_);
                auVar107 = vfmadd132ps_fma(_local_880,auVar107,local_960._0_16_);
                auVar213._0_4_ = auVar107._0_4_ * (float)local_8a0._0_4_;
                auVar213._4_4_ = auVar107._4_4_ * (float)local_8a0._0_4_;
                auVar213._8_4_ = auVar107._8_4_ * (float)local_8a0._0_4_;
                auVar213._12_4_ = auVar107._12_4_ * (float)local_8a0._0_4_;
                auVar107 = vdpps_avx(auVar105,auVar107,0x7f);
                fVar238 = auVar107._0_4_;
                auVar231._0_4_ = auVar105._0_4_ * fVar238;
                auVar231._4_4_ = auVar105._4_4_ * fVar238;
                auVar231._8_4_ = auVar105._8_4_ * fVar238;
                auVar231._12_4_ = auVar105._12_4_ * fVar238;
                auVar107 = vsubps_avx(auVar213,auVar231);
                fVar238 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
                auVar111 = vmaxss_avx(ZEXT416((uint)local_a30._0_4_),
                                      ZEXT416((uint)(local_7c0._0_4_ * fVar177 * 1.9073486e-06)));
                auVar232._0_4_ = auVar107._0_4_ * fVar238;
                auVar232._4_4_ = auVar107._4_4_ * fVar238;
                auVar232._8_4_ = auVar107._8_4_ * fVar238;
                auVar232._12_4_ = auVar107._12_4_ * fVar238;
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar115 = vxorps_avx512vl(auVar105,auVar29);
                auVar110 = vmulps_avx512vl(auVar110,auVar232);
                auVar107 = vdpps_avx(auVar115,auVar109,0x7f);
                auVar112 = vfmadd213ss_fma(auVar106,ZEXT416((uint)local_a30._0_4_),auVar111);
                auVar106 = vdpps_avx(auVar104,auVar110,0x7f);
                auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar274),
                                           ZEXT416((uint)((float)local_a30._0_4_ / fVar275)),
                                           auVar112);
                fVar274 = auVar107._0_4_ + auVar106._0_4_;
                auVar106 = vdpps_avx(local_9d0,auVar109,0x7f);
                auVar107 = vdpps_avx(auVar104,auVar115,0x7f);
                auVar112 = vmulss_avx512f(auVar114,auVar108);
                auVar113 = vaddss_avx512f(auVar113,ZEXT416((uint)(auVar112._0_4_ *
                                                                 auVar108._0_4_ * auVar108._0_4_)));
                auVar112 = vdpps_avx(auVar104,local_9d0,0x7f);
                auVar109 = vfnmadd231ss_fma(auVar107,auVar116,ZEXT416((uint)fVar274));
                auVar112 = vfnmadd231ss_fma(auVar112,auVar116,auVar106);
                auVar107 = vpermilps_avx(local_860._0_16_,0xff);
                fVar254 = fVar254 - auVar107._0_4_;
                auVar108 = vshufps_avx(auVar105,auVar105,0xff);
                auVar107 = vfmsub213ss_fma(auVar109,auVar113,auVar108);
                auVar271._8_4_ = 0x80000000;
                auVar271._0_8_ = 0x8000000080000000;
                auVar271._12_4_ = 0x80000000;
                auVar273 = ZEXT1664(auVar271);
                auVar266._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                auVar266._8_4_ = auVar107._8_4_ ^ 0x80000000;
                auVar266._12_4_ = auVar107._12_4_ ^ 0x80000000;
                auVar269 = ZEXT1664(auVar266);
                auVar112 = ZEXT416((uint)(auVar112._0_4_ * auVar113._0_4_));
                auVar109 = vfmsub231ss_fma(ZEXT416((uint)(auVar106._0_4_ * auVar107._0_4_)),
                                           ZEXT416((uint)fVar274),auVar112);
                auVar107 = vinsertps_avx(auVar266,auVar112,0x1c);
                auVar261._0_8_ = auVar106._0_8_ ^ 0x8000000080000000;
                auVar261._8_4_ = auVar106._8_4_ ^ 0x80000000;
                auVar261._12_4_ = auVar106._12_4_ ^ 0x80000000;
                auVar112 = vinsertps_avx(ZEXT416((uint)fVar274),auVar261,0x10);
                auVar249._0_4_ = auVar109._0_4_;
                auVar249._4_4_ = auVar249._0_4_;
                auVar249._8_4_ = auVar249._0_4_;
                auVar249._12_4_ = auVar249._0_4_;
                auVar106 = vdivps_avx(auVar107,auVar249);
                auVar107 = vdivps_avx(auVar112,auVar249);
                auVar250._0_4_ = fVar276 * auVar106._0_4_ + fVar254 * auVar107._0_4_;
                auVar250._4_4_ = fVar276 * auVar106._4_4_ + fVar254 * auVar107._4_4_;
                auVar250._8_4_ = fVar276 * auVar106._8_4_ + fVar254 * auVar107._8_4_;
                auVar250._12_4_ = fVar276 * auVar106._12_4_ + fVar254 * auVar107._12_4_;
                auVar106 = vsubps_avx(auVar277,auVar250);
                auVar278 = ZEXT1664(auVar106);
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar107 = vandps_avx512vl(auVar116,auVar30);
              } while (auVar110._0_4_ <= auVar107._0_4_);
              auVar107 = vfmadd231ss_fma(ZEXT416((uint)(auVar110._0_4_ + auVar111._0_4_)),local_930,
                                         ZEXT416(0x36000000));
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar116 = vandps_avx512vl(ZEXT416((uint)fVar254),auVar31);
            } while (auVar107._0_4_ <= auVar116._0_4_);
            fVar177 = auVar106._0_4_ + (float)local_940._0_4_;
            if ((fVar195 <= fVar177) &&
               (fVar274 = pre->ray_space[9].vy.field_0.m128[(long)ray], fVar177 <= fVar274)) {
              auVar107 = vmovshdup_avx(auVar106);
              fVar275 = auVar107._0_4_;
              if ((0.0 <= fVar275) && (fVar275 <= 1.0)) {
                auVar107 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a00._0_4_));
                fVar276 = auVar107._0_4_;
                lVar100 = *(long *)(*(long *)(*(long *)k + 0x1e8) + (ulong)(uint)fVar197 * 8);
                if ((*(uint *)(lVar100 + 0x34) & (uint)pre->ray_space[10].vz.field_0.m128[(long)ray]
                    ) != 0) {
                  fVar276 = fVar276 * 1.5 + local_a00._0_4_ * -0.5 * fVar276 * fVar276 * fVar276;
                  auVar251._0_4_ = auVar104._0_4_ * fVar276;
                  auVar251._4_4_ = auVar104._4_4_ * fVar276;
                  auVar251._8_4_ = auVar104._8_4_ * fVar276;
                  auVar251._12_4_ = auVar104._12_4_ * fVar276;
                  auVar108 = vfmadd213ps_fma(auVar108,auVar251,auVar105);
                  auVar107 = vshufps_avx(auVar251,auVar251,0xc9);
                  auVar116 = vshufps_avx(auVar105,auVar105,0xc9);
                  auVar252._0_4_ = auVar251._0_4_ * auVar116._0_4_;
                  auVar252._4_4_ = auVar251._4_4_ * auVar116._4_4_;
                  auVar252._8_4_ = auVar251._8_4_ * auVar116._8_4_;
                  auVar252._12_4_ = auVar251._12_4_ * auVar116._12_4_;
                  auVar112 = vfmsub231ps_fma(auVar252,auVar105,auVar107);
                  auVar107 = vshufps_avx(auVar112,auVar112,0xc9);
                  auVar116 = vshufps_avx(auVar108,auVar108,0xc9);
                  auVar112 = vshufps_avx(auVar112,auVar112,0xd2);
                  auVar184._0_4_ = auVar108._0_4_ * auVar112._0_4_;
                  auVar184._4_4_ = auVar108._4_4_ * auVar112._4_4_;
                  auVar184._8_4_ = auVar108._8_4_ * auVar112._8_4_;
                  auVar184._12_4_ = auVar108._12_4_ * auVar112._12_4_;
                  auVar107 = vfmsub231ps_fma(auVar184,auVar107,auVar116);
                  if ((*(long *)(*(long *)(k + 0x10) + 0x10) == 0) &&
                     (*(long *)(lVar100 + 0x40) == 0)) {
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar177;
                    fVar177 = (float)vextractps_avx(auVar107,1);
                    pre->ray_space[0xe].vz.field_0.m128[(long)ray] = fVar177;
                    uVar203 = vextractps_avx(auVar107,2);
                    *(undefined4 *)((long)pre[1].ray_space + (long)ray * 4 + -0x40) = uVar203;
                    pre[1].ray_space[0].vx.field_0.m128[(long)ray] = auVar107._0_4_;
                    pre[1].ray_space[1].vy.field_0.m128[(long)ray] = fVar275;
                    pre[1].ray_space[2].vz.field_0.m128[(long)ray] = 0.0;
                    pre[1].ray_space[4].vx.field_0.m128[(long)ray] = fVar288;
                    pre[1].ray_space[5].vy.field_0.m128[(long)ray] = fVar197;
                    pre[1].ray_space[6].vz.field_0.m128[(long)ray] = **(float **)(k + 8);
                    pre[1].ray_space[8].vx.field_0.m128[(long)ray] =
                         *(float *)(*(long *)(k + 8) + 4);
                  }
                  else {
                    puVar2 = *(uint **)(k + 8);
                    auVar194 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar194,auVar278);
                    local_400 = vpermps_avx512f(auVar194,ZEXT1664(auVar107));
                    auVar194 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar194,ZEXT1664(auVar107));
                    local_380 = vbroadcastss_avx512f(auVar107);
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar194 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar194);
                    auVar117 = vpcmpeqd_avx2(auVar194._0_32_,auVar194._0_32_);
                    local_a20[3] = auVar117;
                    local_a20[2] = auVar117;
                    local_a20[1] = auVar117;
                    *local_a20 = auVar117;
                    local_240 = vbroadcastss_avx512f(ZEXT416(*puVar2));
                    local_200 = vbroadcastss_avx512f(ZEXT416(puVar2[1]));
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar177;
                    auVar194 = vmovdqa64_avx512f(local_4c0);
                    local_780 = vmovdqa64_avx512f(auVar194);
                    local_ad0 = local_780;
                    local_ac8 = *(undefined8 *)(lVar100 + 0x18);
                    local_ac0 = *(undefined8 *)(k + 8);
                    local_ab0 = (int *)local_400;
                    local_aa8 = 0x10;
                    local_ab8 = pre;
                    if (*(code **)(lVar100 + 0x40) != (code *)0x0) {
                      auVar269 = ZEXT1664(auVar266);
                      auVar273 = ZEXT1664(auVar271);
                      auVar278 = ZEXT1664(auVar106);
                      auVar280 = ZEXT1664(auVar104);
                      auVar282 = ZEXT1664(local_a00._0_16_);
                      auVar286 = ZEXT1664(auVar105);
                      (**(code **)(lVar100 + 0x40))(&local_ad0);
                      auVar194 = vmovdqa64_avx512f(local_780);
                    }
                    uVar21 = vptestmd_avx512f(auVar194,auVar194);
                    if ((short)uVar21 != 0) {
                      pcVar3 = *(code **)(*(byte **)(k + 0x10) + 0x10);
                      if ((pcVar3 != (code *)0x0) &&
                         (((**(byte **)(k + 0x10) & 2) != 0 ||
                          ((*(byte *)(lVar100 + 0x3e) & 0x40) != 0)))) {
                        auVar269 = ZEXT1664(auVar269._0_16_);
                        auVar273 = ZEXT1664(auVar273._0_16_);
                        auVar278 = ZEXT1664(auVar278._0_16_);
                        auVar280 = ZEXT1664(auVar280._0_16_);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        auVar286 = ZEXT1664(auVar286._0_16_);
                        (*pcVar3)(&local_ad0);
                        auVar194 = vmovdqa64_avx512f(local_780);
                      }
                      uVar102 = vptestmd_avx512f(auVar194,auVar194);
                      if ((short)uVar102 != 0) {
                        iVar58 = local_ab0[1];
                        iVar59 = local_ab0[2];
                        iVar60 = local_ab0[3];
                        iVar61 = local_ab0[4];
                        iVar62 = local_ab0[5];
                        iVar63 = local_ab0[6];
                        iVar64 = local_ab0[7];
                        iVar65 = local_ab0[8];
                        iVar66 = local_ab0[9];
                        iVar67 = local_ab0[10];
                        iVar68 = local_ab0[0xb];
                        iVar69 = local_ab0[0xc];
                        iVar70 = local_ab0[0xd];
                        iVar71 = local_ab0[0xe];
                        iVar72 = local_ab0[0xf];
                        pVVar1 = &local_ab8->ray_space[0xe].vz;
                        iVar73 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8->ray_space[0xe].vz.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8->ray_space[0xf].vx.field_0;
                        iVar77 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8->ray_space[0xf].vx.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8->ray_space[0xf].vy.field_0;
                        iVar81 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8->ray_space[0xf].vy.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8->ray_space[0xf].vz.field_0;
                        iVar85 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8->ray_space[0xf].vz.field_0 + 0xc);
                        bVar92 = (byte)uVar102;
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar94 = (byte)(uVar102 >> 8);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar92 & 1) * *local_ab0 |
                                    (uint)!(bool)(bVar92 & 1) * *(int *)&pVVar1->field_0);
                        local_ab8->ray_space[0xe].vz.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8->ray_space[0xe].vz.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8->ray_space[0xe].vz.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8->ray_space[0xf].vx.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8->ray_space[0xf].vx.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8->ray_space[0xf].vx.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8->ray_space[0xf].vx.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8->ray_space[0xf].vy.field_0.m128[0] =
                             (float)((uint)(bVar94 & 1) * iVar65 |
                                    (uint)!(bool)(bVar94 & 1) * iVar80);
                        local_ab8->ray_space[0xf].vy.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8->ray_space[0xf].vy.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8->ray_space[0xf].vy.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8->ray_space[0xf].vz.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8->ray_space[0xf].vz.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8->ray_space[0xf].vz.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8->ray_space[0xf].vz.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        iVar58 = local_ab0[0x11];
                        iVar59 = local_ab0[0x12];
                        iVar60 = local_ab0[0x13];
                        iVar61 = local_ab0[0x14];
                        iVar62 = local_ab0[0x15];
                        iVar63 = local_ab0[0x16];
                        iVar64 = local_ab0[0x17];
                        iVar65 = local_ab0[0x18];
                        iVar66 = local_ab0[0x19];
                        iVar67 = local_ab0[0x1a];
                        iVar68 = local_ab0[0x1b];
                        iVar69 = local_ab0[0x1c];
                        iVar70 = local_ab0[0x1d];
                        iVar71 = local_ab0[0x1e];
                        iVar72 = local_ab0[0x1f];
                        iVar73 = local_ab8[1].depth_scale.field_0.i[1];
                        iVar74 = local_ab8[1].depth_scale.field_0.i[2];
                        iVar75 = local_ab8[1].depth_scale.field_0.i[3];
                        iVar76 = local_ab8[1].depth_scale.field_0.i[4];
                        iVar77 = local_ab8[1].depth_scale.field_0.i[5];
                        iVar78 = local_ab8[1].depth_scale.field_0.i[6];
                        iVar79 = local_ab8[1].depth_scale.field_0.i[7];
                        iVar80 = local_ab8[1].depth_scale.field_0.i[8];
                        iVar81 = local_ab8[1].depth_scale.field_0.i[9];
                        iVar82 = local_ab8[1].depth_scale.field_0.i[10];
                        iVar83 = local_ab8[1].depth_scale.field_0.i[0xb];
                        iVar84 = local_ab8[1].depth_scale.field_0.i[0xc];
                        iVar85 = local_ab8[1].depth_scale.field_0.i[0xd];
                        iVar86 = local_ab8[1].depth_scale.field_0.i[0xe];
                        iVar87 = local_ab8[1].depth_scale.field_0.i[0xf];
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        local_ab8[1].depth_scale.field_0.i[0] =
                             (uint)(bVar92 & 1) * local_ab0[0x10] |
                             (uint)!(bool)(bVar92 & 1) * local_ab8[1].depth_scale.field_0.i[0];
                        local_ab8[1].depth_scale.field_0.i[1] =
                             (uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73;
                        local_ab8[1].depth_scale.field_0.i[2] =
                             (uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74;
                        local_ab8[1].depth_scale.field_0.i[3] =
                             (uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75;
                        local_ab8[1].depth_scale.field_0.i[4] =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76;
                        local_ab8[1].depth_scale.field_0.i[5] =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77;
                        local_ab8[1].depth_scale.field_0.i[6] =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78;
                        local_ab8[1].depth_scale.field_0.i[7] =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79;
                        local_ab8[1].depth_scale.field_0.i[8] =
                             (uint)(bVar94 & 1) * iVar65 | (uint)!(bool)(bVar94 & 1) * iVar80;
                        local_ab8[1].depth_scale.field_0.i[9] =
                             (uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81;
                        local_ab8[1].depth_scale.field_0.i[10] =
                             (uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82;
                        local_ab8[1].depth_scale.field_0.i[0xb] =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83;
                        local_ab8[1].depth_scale.field_0.i[0xc] =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84;
                        local_ab8[1].depth_scale.field_0.i[0xd] =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85;
                        local_ab8[1].depth_scale.field_0.i[0xe] =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86;
                        local_ab8[1].depth_scale.field_0.i[0xf] =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87;
                        iVar58 = local_ab0[0x21];
                        iVar59 = local_ab0[0x22];
                        iVar60 = local_ab0[0x23];
                        iVar61 = local_ab0[0x24];
                        iVar62 = local_ab0[0x25];
                        iVar63 = local_ab0[0x26];
                        iVar64 = local_ab0[0x27];
                        iVar65 = local_ab0[0x28];
                        iVar66 = local_ab0[0x29];
                        iVar67 = local_ab0[0x2a];
                        iVar68 = local_ab0[0x2b];
                        iVar69 = local_ab0[0x2c];
                        iVar70 = local_ab0[0x2d];
                        iVar71 = local_ab0[0x2e];
                        iVar72 = local_ab0[0x2f];
                        iVar73 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8[1].ray_space[0].vx.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8[1].ray_space[0].vy.field_0;
                        iVar77 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8[1].ray_space[0].vy.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8[1].ray_space[0].vz.field_0;
                        iVar81 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8[1].ray_space[0].vz.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8[1].ray_space[1].vx.field_0;
                        iVar85 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8[1].ray_space[1].vx.field_0 + 0xc);
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        local_ab8[1].ray_space[0].vx.field_0.m128[0] =
                             (float)((uint)(bVar92 & 1) * local_ab0[0x20] |
                                    (uint)!(bool)(bVar92 & 1) *
                                    *(int *)&local_ab8[1].ray_space[0].vx.field_0);
                        local_ab8[1].ray_space[0].vx.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8[1].ray_space[0].vx.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8[1].ray_space[0].vx.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8[1].ray_space[0].vy.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8[1].ray_space[0].vy.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8[1].ray_space[0].vy.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8[1].ray_space[0].vy.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8[1].ray_space[0].vz.field_0.m128[0] =
                             (float)((uint)(bVar94 & 1) * iVar65 |
                                    (uint)!(bool)(bVar94 & 1) * iVar80);
                        local_ab8[1].ray_space[0].vz.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8[1].ray_space[0].vz.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8[1].ray_space[0].vz.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8[1].ray_space[1].vx.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8[1].ray_space[1].vx.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8[1].ray_space[1].vx.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8[1].ray_space[1].vx.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        iVar58 = local_ab0[0x31];
                        iVar59 = local_ab0[0x32];
                        iVar60 = local_ab0[0x33];
                        iVar61 = local_ab0[0x34];
                        iVar62 = local_ab0[0x35];
                        iVar63 = local_ab0[0x36];
                        iVar64 = local_ab0[0x37];
                        iVar65 = local_ab0[0x38];
                        iVar66 = local_ab0[0x39];
                        iVar67 = local_ab0[0x3a];
                        iVar68 = local_ab0[0x3b];
                        iVar69 = local_ab0[0x3c];
                        iVar70 = local_ab0[0x3d];
                        iVar71 = local_ab0[0x3e];
                        iVar72 = local_ab0[0x3f];
                        pVVar1 = &local_ab8[1].ray_space[1].vy;
                        iVar73 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8[1].ray_space[1].vy.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8[1].ray_space[1].vz.field_0;
                        iVar77 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8[1].ray_space[1].vz.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8[1].ray_space[2].vx.field_0;
                        iVar81 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8[1].ray_space[2].vx.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8[1].ray_space[2].vy.field_0;
                        iVar85 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8[1].ray_space[2].vy.field_0 + 0xc);
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar92 & 1) * local_ab0[0x30] |
                                    (uint)!(bool)(bVar92 & 1) * *(int *)&pVVar1->field_0);
                        local_ab8[1].ray_space[1].vy.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8[1].ray_space[1].vy.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8[1].ray_space[1].vy.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8[1].ray_space[1].vz.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8[1].ray_space[1].vz.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8[1].ray_space[1].vz.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8[1].ray_space[1].vz.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8[1].ray_space[2].vx.field_0.m128[0] =
                             (float)((uint)(bVar94 & 1) * iVar65 |
                                    (uint)!(bool)(bVar94 & 1) * iVar80);
                        local_ab8[1].ray_space[2].vx.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8[1].ray_space[2].vx.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8[1].ray_space[2].vx.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8[1].ray_space[2].vy.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8[1].ray_space[2].vy.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8[1].ray_space[2].vy.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8[1].ray_space[2].vy.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        iVar58 = local_ab0[0x41];
                        iVar59 = local_ab0[0x42];
                        iVar60 = local_ab0[0x43];
                        iVar61 = local_ab0[0x44];
                        iVar62 = local_ab0[0x45];
                        iVar63 = local_ab0[0x46];
                        iVar64 = local_ab0[0x47];
                        iVar65 = local_ab0[0x48];
                        iVar66 = local_ab0[0x49];
                        iVar67 = local_ab0[0x4a];
                        iVar68 = local_ab0[0x4b];
                        iVar69 = local_ab0[0x4c];
                        iVar70 = local_ab0[0x4d];
                        iVar71 = local_ab0[0x4e];
                        iVar72 = local_ab0[0x4f];
                        pVVar1 = &local_ab8[1].ray_space[2].vz;
                        iVar73 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 4);
                        iVar74 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 8);
                        iVar75 = *(int *)((long)&local_ab8[1].ray_space[2].vz.field_0 + 0xc);
                        iVar76 = *(int *)&local_ab8[1].ray_space[3].vx.field_0;
                        iVar77 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 4);
                        iVar78 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 8);
                        iVar79 = *(int *)((long)&local_ab8[1].ray_space[3].vx.field_0 + 0xc);
                        iVar80 = *(int *)&local_ab8[1].ray_space[3].vy.field_0;
                        iVar81 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 4);
                        iVar82 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 8);
                        iVar83 = *(int *)((long)&local_ab8[1].ray_space[3].vy.field_0 + 0xc);
                        iVar84 = *(int *)&local_ab8[1].ray_space[3].vz.field_0;
                        iVar85 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 4);
                        iVar86 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 8);
                        iVar87 = *(int *)((long)&local_ab8[1].ray_space[3].vz.field_0 + 0xc);
                        bVar101 = (bool)((byte)(uVar102 >> 1) & 1);
                        bVar4 = (bool)((byte)(uVar102 >> 2) & 1);
                        bVar5 = (bool)((byte)(uVar102 >> 3) & 1);
                        bVar6 = (bool)((byte)(uVar102 >> 4) & 1);
                        bVar7 = (bool)((byte)(uVar102 >> 5) & 1);
                        bVar8 = (bool)((byte)(uVar102 >> 6) & 1);
                        bVar9 = (bool)((byte)(uVar102 >> 7) & 1);
                        bVar10 = (bool)((byte)(uVar102 >> 9) & 1);
                        bVar11 = (bool)((byte)(uVar102 >> 10) & 1);
                        bVar12 = (bool)((byte)(uVar102 >> 0xb) & 1);
                        bVar13 = (bool)((byte)(uVar102 >> 0xc) & 1);
                        bVar14 = (bool)((byte)(uVar102 >> 0xd) & 1);
                        bVar15 = (bool)((byte)(uVar102 >> 0xe) & 1);
                        bVar16 = SUB81(uVar102 >> 0xf,0);
                        (pVVar1->field_0).m128[0] =
                             (float)((uint)(bVar92 & 1) * local_ab0[0x40] |
                                    (uint)!(bool)(bVar92 & 1) * *(int *)&pVVar1->field_0);
                        local_ab8[1].ray_space[2].vz.field_0.m128[1] =
                             (float)((uint)bVar101 * iVar58 | (uint)!bVar101 * iVar73);
                        local_ab8[1].ray_space[2].vz.field_0.m128[2] =
                             (float)((uint)bVar4 * iVar59 | (uint)!bVar4 * iVar74);
                        local_ab8[1].ray_space[2].vz.field_0.m128[3] =
                             (float)((uint)bVar5 * iVar60 | (uint)!bVar5 * iVar75);
                        local_ab8[1].ray_space[3].vx.field_0.m128[0] =
                             (float)((uint)bVar6 * iVar61 | (uint)!bVar6 * iVar76);
                        local_ab8[1].ray_space[3].vx.field_0.m128[1] =
                             (float)((uint)bVar7 * iVar62 | (uint)!bVar7 * iVar77);
                        local_ab8[1].ray_space[3].vx.field_0.m128[2] =
                             (float)((uint)bVar8 * iVar63 | (uint)!bVar8 * iVar78);
                        local_ab8[1].ray_space[3].vx.field_0.m128[3] =
                             (float)((uint)bVar9 * iVar64 | (uint)!bVar9 * iVar79);
                        local_ab8[1].ray_space[3].vy.field_0.m128[0] =
                             (float)((uint)(bVar94 & 1) * iVar65 |
                                    (uint)!(bool)(bVar94 & 1) * iVar80);
                        local_ab8[1].ray_space[3].vy.field_0.m128[1] =
                             (float)((uint)bVar10 * iVar66 | (uint)!bVar10 * iVar81);
                        local_ab8[1].ray_space[3].vy.field_0.m128[2] =
                             (float)((uint)bVar11 * iVar67 | (uint)!bVar11 * iVar82);
                        local_ab8[1].ray_space[3].vy.field_0.m128[3] =
                             (float)((uint)bVar12 * iVar68 | (uint)!bVar12 * iVar83);
                        local_ab8[1].ray_space[3].vz.field_0.m128[0] =
                             (float)((uint)bVar13 * iVar69 | (uint)!bVar13 * iVar84);
                        local_ab8[1].ray_space[3].vz.field_0.m128[1] =
                             (float)((uint)bVar14 * iVar70 | (uint)!bVar14 * iVar85);
                        local_ab8[1].ray_space[3].vz.field_0.m128[2] =
                             (float)((uint)bVar15 * iVar71 | (uint)!bVar15 * iVar86);
                        local_ab8[1].ray_space[3].vz.field_0.m128[3] =
                             (float)((uint)bVar16 * iVar72 | (uint)!bVar16 * iVar87);
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x50));
                        auVar194 = vmovdqu32_avx512f(auVar194);
                        *(undefined1 (*) [64])(local_ab8[1].ray_space + 4) = auVar194;
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x60));
                        auVar194 = vmovdqu32_avx512f(auVar194);
                        *(undefined1 (*) [64])&local_ab8[1].ray_space[5].vy = auVar194;
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x70));
                        auVar194 = vmovdqa32_avx512f(auVar194);
                        *(undefined1 (*) [64])&local_ab8[1].ray_space[6].vz = auVar194;
                        auVar194 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ab0 + 0x80));
                        auVar194 = vmovdqa32_avx512f(auVar194);
                        *(undefined1 (*) [64])(local_ab8[1].ray_space + 8) = auVar194;
                        goto LAB_019e104d;
                      }
                    }
                    pre->ray_space[9].vy.field_0.m128[(long)ray] = fVar274;
                  }
                }
              }
            }
LAB_019e104d:
            uVar203 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
            auVar263._4_4_ = uVar203;
            auVar263._0_4_ = uVar203;
            auVar263._8_4_ = uVar203;
            auVar263._12_4_ = uVar203;
            auVar263._16_4_ = uVar203;
            auVar263._20_4_ = uVar203;
            auVar263._24_4_ = uVar203;
            auVar263._28_4_ = uVar203;
            auVar194 = ZEXT3264(auVar263);
            auVar89._4_4_ = fStack_71c;
            auVar89._0_4_ = local_720;
            auVar89._8_4_ = fStack_718;
            auVar89._12_4_ = fStack_714;
            auVar89._16_4_ = fStack_710;
            auVar89._20_4_ = fStack_70c;
            auVar89._24_4_ = fStack_708;
            auVar89._28_4_ = fStack_704;
            uVar21 = vcmpps_avx512vl(auVar263,auVar89,0xd);
          }
          uVar23 = vpcmpd_avx512vl(local_6e0,local_660,1);
          uVar22 = vpcmpd_avx512vl(local_6e0,_local_740,1);
          auVar216._0_4_ = (float)local_7e0._0_4_ + (float)local_540._0_4_;
          auVar216._4_4_ = (float)local_7e0._4_4_ + (float)local_540._4_4_;
          auVar216._8_4_ = fStack_7d8 + fStack_538;
          auVar216._12_4_ = fStack_7d4 + fStack_534;
          auVar216._16_4_ = fStack_7d0 + fStack_530;
          auVar216._20_4_ = fStack_7cc + fStack_52c;
          auVar216._24_4_ = fStack_7c8 + fStack_528;
          auVar216._28_4_ = fStack_7c4 + fStack_524;
          uVar203 = auVar194._0_4_;
          auVar233._4_4_ = uVar203;
          auVar233._0_4_ = uVar203;
          auVar233._8_4_ = uVar203;
          auVar233._12_4_ = uVar203;
          auVar233._16_4_ = uVar203;
          auVar233._20_4_ = uVar203;
          auVar233._24_4_ = uVar203;
          auVar233._28_4_ = uVar203;
          uVar21 = vcmpps_avx512vl(auVar216,auVar233,2);
          bVar97 = bVar97 & (byte)uVar23 & (byte)uVar21;
          auVar253._0_4_ = (float)local_7e0._0_4_ + (float)local_6a0._0_4_;
          auVar253._4_4_ = (float)local_7e0._4_4_ + (float)local_6a0._4_4_;
          auVar253._8_4_ = fStack_7d8 + fStack_698;
          auVar253._12_4_ = fStack_7d4 + fStack_694;
          auVar253._16_4_ = fStack_7d0 + fStack_690;
          auVar253._20_4_ = fStack_7cc + fStack_68c;
          auVar253._24_4_ = fStack_7c8 + fStack_688;
          auVar253._28_4_ = fStack_7c4 + fStack_684;
          uVar21 = vcmpps_avx512vl(auVar253,auVar233,2);
          bVar91 = bVar91 & (byte)uVar22 & (byte)uVar21 | bVar97;
          if (bVar91 != 0) {
            abStack_1a0[uVar95 * 0x60] = bVar91;
            bVar101 = (bool)(bVar97 >> 1 & 1);
            bVar4 = (bool)(bVar97 >> 2 & 1);
            bVar5 = (bool)(bVar97 >> 3 & 1);
            bVar6 = (bool)(bVar97 >> 4 & 1);
            bVar7 = (bool)(bVar97 >> 5 & 1);
            auStack_180[uVar95 * 0x18] =
                 (uint)(bVar97 & 1) * local_540._0_4_ | (uint)!(bool)(bVar97 & 1) * local_6a0._0_4_;
            auStack_180[uVar95 * 0x18 + 1] =
                 (uint)bVar101 * local_540._4_4_ | (uint)!bVar101 * local_6a0._4_4_;
            auStack_180[uVar95 * 0x18 + 2] =
                 (uint)bVar4 * (int)fStack_538 | (uint)!bVar4 * (int)fStack_698;
            auStack_180[uVar95 * 0x18 + 3] =
                 (uint)bVar5 * (int)fStack_534 | (uint)!bVar5 * (int)fStack_694;
            auStack_180[uVar95 * 0x18 + 4] =
                 (uint)bVar6 * (int)fStack_530 | (uint)!bVar6 * (int)fStack_690;
            auStack_180[uVar95 * 0x18 + 5] =
                 (uint)bVar7 * (int)fStack_52c | (uint)!bVar7 * (int)fStack_68c;
            auStack_180[uVar95 * 0x18 + 6] =
                 (uint)(bVar97 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar97 >> 6) * (int)fStack_688;
            (&fStack_164)[uVar95 * 0x18] = fStack_684;
            uVar102 = vmovlps_avx(local_6f0);
            (&uStack_160)[uVar95 * 0xc] = uVar102;
            aiStack_158[uVar95 * 0x18] = iVar98 + 1;
            uVar95 = (ulong)((int)uVar95 + 1);
          }
          auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar291 = ZEXT3264(auVar117);
          auVar194 = ZEXT3264(_DAT_01f7b040);
          lVar100 = local_a18;
          context = local_a10;
        }
      }
    }
    do {
      uVar103 = (uint)uVar95;
      uVar95 = (ulong)(uVar103 - 1);
      if (uVar103 == 0) {
        uVar203 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
        auVar37._4_4_ = uVar203;
        auVar37._0_4_ = uVar203;
        auVar37._8_4_ = uVar203;
        auVar37._12_4_ = uVar203;
        auVar37._16_4_ = uVar203;
        auVar37._20_4_ = uVar203;
        auVar37._24_4_ = uVar203;
        auVar37._28_4_ = uVar203;
        uVar21 = vcmpps_avx512vl(local_640,auVar37,2);
        local_a08 = (ulong)((uint)local_a08 & (uint)uVar21);
        goto LAB_019dea51;
      }
      auVar117 = *(undefined1 (*) [32])(auStack_180 + uVar95 * 0x18);
      auVar217._0_4_ = auVar117._0_4_ + (float)local_7e0._0_4_;
      auVar217._4_4_ = auVar117._4_4_ + (float)local_7e0._4_4_;
      auVar217._8_4_ = auVar117._8_4_ + fStack_7d8;
      auVar217._12_4_ = auVar117._12_4_ + fStack_7d4;
      auVar217._16_4_ = auVar117._16_4_ + fStack_7d0;
      auVar217._20_4_ = auVar117._20_4_ + fStack_7cc;
      auVar217._24_4_ = auVar117._24_4_ + fStack_7c8;
      auVar217._28_4_ = auVar117._28_4_ + fStack_7c4;
      uVar203 = *(undefined4 *)((long)&pre->ray_space[9].vy.field_0 + (long)ray * 4);
      auVar36._4_4_ = uVar203;
      auVar36._0_4_ = uVar203;
      auVar36._8_4_ = uVar203;
      auVar36._12_4_ = uVar203;
      auVar36._16_4_ = uVar203;
      auVar36._20_4_ = uVar203;
      auVar36._24_4_ = uVar203;
      auVar36._28_4_ = uVar203;
      uVar21 = vcmpps_avx512vl(auVar217,auVar36,2);
      uVar170 = (uint)uVar21 & (uint)abStack_1a0[uVar95 * 0x60];
    } while (uVar170 == 0);
    uVar102 = (&uStack_160)[uVar95 * 0xc];
    auVar214._8_8_ = 0;
    auVar214._0_8_ = uVar102;
    auVar234._8_4_ = 0x7f800000;
    auVar234._0_8_ = 0x7f8000007f800000;
    auVar234._12_4_ = 0x7f800000;
    auVar234._16_4_ = 0x7f800000;
    auVar234._20_4_ = 0x7f800000;
    auVar234._24_4_ = 0x7f800000;
    auVar234._28_4_ = 0x7f800000;
    auVar118 = vblendmps_avx512vl(auVar234,auVar117);
    bVar91 = (byte)uVar170;
    auVar169._0_4_ =
         (uint)(bVar91 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar91 & 1) * (int)auVar117._0_4_;
    bVar101 = (bool)((byte)(uVar170 >> 1) & 1);
    auVar169._4_4_ = (uint)bVar101 * auVar118._4_4_ | (uint)!bVar101 * (int)auVar117._4_4_;
    bVar101 = (bool)((byte)(uVar170 >> 2) & 1);
    auVar169._8_4_ = (uint)bVar101 * auVar118._8_4_ | (uint)!bVar101 * (int)auVar117._8_4_;
    bVar101 = (bool)((byte)(uVar170 >> 3) & 1);
    auVar169._12_4_ = (uint)bVar101 * auVar118._12_4_ | (uint)!bVar101 * (int)auVar117._12_4_;
    bVar101 = (bool)((byte)(uVar170 >> 4) & 1);
    auVar169._16_4_ = (uint)bVar101 * auVar118._16_4_ | (uint)!bVar101 * (int)auVar117._16_4_;
    bVar101 = (bool)((byte)(uVar170 >> 5) & 1);
    auVar169._20_4_ = (uint)bVar101 * auVar118._20_4_ | (uint)!bVar101 * (int)auVar117._20_4_;
    bVar101 = (bool)((byte)(uVar170 >> 6) & 1);
    auVar169._24_4_ = (uint)bVar101 * auVar118._24_4_ | (uint)!bVar101 * (int)auVar117._24_4_;
    auVar169._28_4_ =
         (uVar170 >> 7) * auVar118._28_4_ | (uint)!SUB41(uVar170 >> 7,0) * (int)auVar117._28_4_;
    auVar117 = vshufps_avx(auVar169,auVar169,0xb1);
    auVar117 = vminps_avx(auVar169,auVar117);
    auVar118 = vshufpd_avx(auVar117,auVar117,5);
    auVar117 = vminps_avx(auVar117,auVar118);
    auVar118 = vpermpd_avx2(auVar117,0x4e);
    auVar117 = vminps_avx(auVar117,auVar118);
    uVar21 = vcmpps_avx512vl(auVar169,auVar117,0);
    bVar99 = (byte)uVar21 & bVar91;
    if (bVar99 != 0) {
      uVar170 = (uint)bVar99;
    }
    uVar171 = 0;
    for (; (uVar170 & 1) == 0; uVar170 = uVar170 >> 1 | 0x80000000) {
      uVar171 = uVar171 + 1;
    }
    iVar98 = aiStack_158[uVar95 * 0x18];
    bVar91 = ~('\x01' << ((byte)uVar171 & 0x1f)) & bVar91;
    abStack_1a0[uVar95 * 0x60] = bVar91;
    if (bVar91 == 0) {
      uVar103 = uVar103 - 1;
    }
    uVar203 = (undefined4)uVar102;
    auVar193._4_4_ = uVar203;
    auVar193._0_4_ = uVar203;
    auVar193._8_4_ = uVar203;
    auVar193._12_4_ = uVar203;
    auVar193._16_4_ = uVar203;
    auVar193._20_4_ = uVar203;
    auVar193._24_4_ = uVar203;
    auVar193._28_4_ = uVar203;
    auVar106 = vmovshdup_avx(auVar214);
    auVar106 = vsubps_avx(auVar106,auVar214);
    auVar218._0_4_ = auVar106._0_4_;
    auVar218._4_4_ = auVar218._0_4_;
    auVar218._8_4_ = auVar218._0_4_;
    auVar218._12_4_ = auVar218._0_4_;
    auVar218._16_4_ = auVar218._0_4_;
    auVar218._20_4_ = auVar218._0_4_;
    auVar218._24_4_ = auVar218._0_4_;
    auVar218._28_4_ = auVar218._0_4_;
    auVar106 = vfmadd132ps_fma(auVar218,auVar193,auVar194._0_32_);
    local_400._0_32_ = ZEXT1632(auVar106);
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_400 + (ulong)uVar171 * 4);
    uVar95 = (ulong)uVar103;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }